

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_h<embree::avx2::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  float *pfVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [28];
  ulong uVar77;
  long lVar78;
  ulong uVar79;
  RTCIntersectArguments *pRVar80;
  ulong uVar81;
  uint uVar82;
  Geometry *geometry;
  long lVar83;
  byte bVar84;
  undefined4 uVar85;
  undefined8 unaff_R13;
  long lVar86;
  undefined8 uVar87;
  float fVar105;
  vint4 bi_2;
  undefined1 auVar88 [16];
  float fVar103;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar104;
  float fVar106;
  float fVar107;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar94 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [64];
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar137 [32];
  undefined1 auVar133 [32];
  undefined1 auVar138 [64];
  undefined1 auVar134 [32];
  undefined1 auVar139 [64];
  vint4 ai_2;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  vint4 ai;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vint4 ai_1;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  float fVar185;
  undefined1 auVar186 [16];
  float fVar191;
  undefined1 auVar187 [32];
  float fVar189;
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [64];
  undefined4 uVar195;
  undefined1 auVar196 [32];
  float fVar197;
  float fVar199;
  undefined1 auVar198 [16];
  undefined8 uVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar205 [64];
  RTCFilterFunctionNArguments args;
  int local_7b4;
  long local_7b0;
  Primitive *local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  ulong local_710;
  Precalculations *local_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined8 local_560;
  undefined4 local_558;
  float local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  uint local_544;
  uint local_540;
  ulong local_528;
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3d0 [8];
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar177 [16];
  
  local_708 = pre;
  PVar9 = prim[1];
  uVar77 = (ulong)(byte)PVar9;
  fVar126 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar20 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  auVar155._0_4_ = fVar126 * (ray->dir).field_0.m128[0];
  auVar155._4_4_ = fVar126 * (ray->dir).field_0.m128[1];
  auVar155._8_4_ = fVar126 * (ray->dir).field_0.m128[2];
  auVar155._12_4_ = fVar126 * (ray->dir).field_0.m128[3];
  auVar88._0_4_ = fVar126 * auVar20._0_4_;
  auVar88._4_4_ = fVar126 * auVar20._4_4_;
  auVar88._8_4_ = fVar126 * auVar20._8_4_;
  auVar88._12_4_ = fVar126 * auVar20._12_4_;
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 4 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xc + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xd + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x12 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x13 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar188 = ZEXT1664(auVar90);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0x14 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar201._4_4_ = auVar155._0_4_;
  auVar201._0_4_ = auVar155._0_4_;
  auVar201._8_4_ = auVar155._0_4_;
  auVar201._12_4_ = auVar155._0_4_;
  auVar112 = vshufps_avx(auVar155,auVar155,0x55);
  auVar89 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar126 = auVar89._0_4_;
  auVar184._0_4_ = fVar126 * auVar16._0_4_;
  fVar103 = auVar89._4_4_;
  auVar184._4_4_ = fVar103 * auVar16._4_4_;
  fVar105 = auVar89._8_4_;
  auVar184._8_4_ = fVar105 * auVar16._8_4_;
  fVar104 = auVar89._12_4_;
  auVar184._12_4_ = fVar104 * auVar16._12_4_;
  auVar176._0_4_ = auVar19._0_4_ * fVar126;
  auVar176._4_4_ = auVar19._4_4_ * fVar103;
  auVar176._8_4_ = auVar19._8_4_ * fVar105;
  auVar176._12_4_ = auVar19._12_4_ * fVar104;
  auVar169._0_4_ = auVar127._0_4_ * fVar126;
  auVar169._4_4_ = auVar127._4_4_ * fVar103;
  auVar169._8_4_ = auVar127._8_4_ * fVar105;
  auVar169._12_4_ = auVar127._12_4_ * fVar104;
  auVar89 = vfmadd231ps_fma(auVar184,auVar112,auVar15);
  auVar113 = vfmadd231ps_fma(auVar176,auVar112,auVar18);
  auVar112 = vfmadd231ps_fma(auVar169,auVar90,auVar112);
  auVar140 = vfmadd231ps_fma(auVar89,auVar201,auVar20);
  auVar113 = vfmadd231ps_fma(auVar113,auVar201,auVar17);
  auVar147 = vfmadd231ps_fma(auVar112,auVar91,auVar201);
  auVar202._4_4_ = auVar88._0_4_;
  auVar202._0_4_ = auVar88._0_4_;
  auVar202._8_4_ = auVar88._0_4_;
  auVar202._12_4_ = auVar88._0_4_;
  auVar112 = vshufps_avx(auVar88,auVar88,0x55);
  auVar89 = vshufps_avx(auVar88,auVar88,0xaa);
  fVar126 = auVar89._0_4_;
  auVar156._0_4_ = fVar126 * auVar16._0_4_;
  fVar103 = auVar89._4_4_;
  auVar156._4_4_ = fVar103 * auVar16._4_4_;
  fVar105 = auVar89._8_4_;
  auVar156._8_4_ = fVar105 * auVar16._8_4_;
  fVar104 = auVar89._12_4_;
  auVar156._12_4_ = fVar104 * auVar16._12_4_;
  auVar111._0_4_ = auVar19._0_4_ * fVar126;
  auVar111._4_4_ = auVar19._4_4_ * fVar103;
  auVar111._8_4_ = auVar19._8_4_ * fVar105;
  auVar111._12_4_ = auVar19._12_4_ * fVar104;
  auVar89._0_4_ = auVar127._0_4_ * fVar126;
  auVar89._4_4_ = auVar127._4_4_ * fVar103;
  auVar89._8_4_ = auVar127._8_4_ * fVar105;
  auVar89._12_4_ = auVar127._12_4_ * fVar104;
  auVar15 = vfmadd231ps_fma(auVar156,auVar112,auVar15);
  auVar16 = vfmadd231ps_fma(auVar111,auVar112,auVar18);
  auVar18 = vfmadd231ps_fma(auVar89,auVar112,auVar90);
  auVar19 = vfmadd231ps_fma(auVar15,auVar202,auVar20);
  auVar90 = vfmadd231ps_fma(auVar16,auVar202,auVar17);
  auVar127 = vfmadd231ps_fma(auVar18,auVar202,auVar91);
  local_2b0._8_4_ = 0x7fffffff;
  local_2b0._0_8_ = 0x7fffffff7fffffff;
  local_2b0._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx(auVar140,local_2b0);
  auVar146._8_4_ = 0x219392ef;
  auVar146._0_8_ = 0x219392ef219392ef;
  auVar146._12_4_ = 0x219392ef;
  auVar20 = vcmpps_avx(auVar20,auVar146,1);
  auVar15 = vblendvps_avx(auVar140,auVar146,auVar20);
  auVar20 = vandps_avx(auVar113,local_2b0);
  auVar20 = vcmpps_avx(auVar20,auVar146,1);
  auVar16 = vblendvps_avx(auVar113,auVar146,auVar20);
  auVar20 = vandps_avx(local_2b0,auVar147);
  auVar20 = vcmpps_avx(auVar20,auVar146,1);
  auVar20 = vblendvps_avx(auVar147,auVar146,auVar20);
  auVar17 = vrcpps_avx(auVar15);
  auVar170._8_4_ = 0x3f800000;
  auVar170._0_8_ = 0x3f8000003f800000;
  auVar170._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar170);
  auVar17 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar170);
  auVar18 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar15,auVar170);
  auVar91 = vfmadd132ps_fma(auVar20,auVar15,auVar15);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar77 * 7 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar147._0_4_ = auVar17._0_4_ * auVar20._0_4_;
  auVar147._4_4_ = auVar17._4_4_ * auVar20._4_4_;
  auVar147._8_4_ = auVar17._8_4_ * auVar20._8_4_;
  auVar147._12_4_ = auVar17._12_4_ * auVar20._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar77 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar15);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar157._0_4_ = auVar17._0_4_ * auVar20._0_4_;
  auVar157._4_4_ = auVar17._4_4_ * auVar20._4_4_;
  auVar157._8_4_ = auVar17._8_4_ * auVar20._8_4_;
  auVar157._12_4_ = auVar17._12_4_ * auVar20._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar77 * 0xe + 6);
  auVar20 = vpmovsxwd_avx(auVar16);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar90);
  auVar164._0_4_ = auVar18._0_4_ * auVar20._0_4_;
  auVar164._4_4_ = auVar18._4_4_ * auVar20._4_4_;
  auVar164._8_4_ = auVar18._8_4_ * auVar20._8_4_;
  auVar164._12_4_ = auVar18._12_4_ * auVar20._12_4_;
  auVar113._1_3_ = 0;
  auVar113[0] = PVar9;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar20 = vpmovsxwd_avx(auVar17);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar90);
  auVar112._0_4_ = auVar18._0_4_ * auVar20._0_4_;
  auVar112._4_4_ = auVar18._4_4_ * auVar20._4_4_;
  auVar112._8_4_ = auVar18._8_4_ * auVar20._8_4_;
  auVar112._12_4_ = auVar18._12_4_ * auVar20._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar77 * 0x15 + 6);
  auVar20 = vpmovsxwd_avx(auVar18);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar127);
  auVar140._0_4_ = auVar91._0_4_ * auVar20._0_4_;
  auVar140._4_4_ = auVar91._4_4_ * auVar20._4_4_;
  auVar140._8_4_ = auVar91._8_4_ * auVar20._8_4_;
  auVar140._12_4_ = auVar91._12_4_ * auVar20._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar77 * 0x17 + 6);
  auVar20 = vpmovsxwd_avx(auVar19);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar127);
  auVar90._0_4_ = auVar91._0_4_ * auVar20._0_4_;
  auVar90._4_4_ = auVar91._4_4_ * auVar20._4_4_;
  auVar90._8_4_ = auVar91._8_4_ * auVar20._8_4_;
  auVar90._12_4_ = auVar91._12_4_ * auVar20._12_4_;
  auVar20 = vpminsd_avx(auVar147,auVar157);
  auVar15 = vpminsd_avx(auVar164,auVar112);
  auVar20 = vmaxps_avx(auVar20,auVar15);
  auVar15 = vpminsd_avx(auVar140,auVar90);
  uVar85 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar177._4_4_ = uVar85;
  auVar177._0_4_ = uVar85;
  auVar177._8_4_ = uVar85;
  auVar177._12_4_ = uVar85;
  auVar183 = ZEXT1664(auVar177);
  auVar15 = vmaxps_avx(auVar15,auVar177);
  auVar20 = vmaxps_avx(auVar20,auVar15);
  local_2c0._0_4_ = auVar20._0_4_ * 0.99999964;
  local_2c0._4_4_ = auVar20._4_4_ * 0.99999964;
  local_2c0._8_4_ = auVar20._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar20._12_4_ * 0.99999964;
  auVar20 = vpmaxsd_avx(auVar147,auVar157);
  auVar15 = vpmaxsd_avx(auVar164,auVar112);
  auVar20 = vminps_avx(auVar20,auVar15);
  auVar15 = vpmaxsd_avx(auVar140,auVar90);
  fVar126 = ray->tfar;
  auVar127._4_4_ = fVar126;
  auVar127._0_4_ = fVar126;
  auVar127._8_4_ = fVar126;
  auVar127._12_4_ = fVar126;
  auVar15 = vminps_avx(auVar15,auVar127);
  auVar20 = vminps_avx(auVar20,auVar15);
  auVar91._0_4_ = auVar20._0_4_ * 1.0000004;
  auVar91._4_4_ = auVar20._4_4_ * 1.0000004;
  auVar91._8_4_ = auVar20._8_4_ * 1.0000004;
  auVar91._12_4_ = auVar20._12_4_ * 1.0000004;
  auVar113[4] = PVar9;
  auVar113._5_3_ = 0;
  auVar113[8] = PVar9;
  auVar113._9_3_ = 0;
  auVar113[0xc] = PVar9;
  auVar113._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar113,_DAT_01f4ad30);
  auVar20 = vcmpps_avx(local_2c0,auVar91,2);
  auVar20 = vandps_avx(auVar20,auVar15);
  uVar85 = vmovmskps_avx(auVar20);
  local_4a0 = mm_lookupmask_ps._16_8_;
  uStack_498 = mm_lookupmask_ps._24_8_;
  uStack_490 = mm_lookupmask_ps._16_8_;
  uStack_488 = mm_lookupmask_ps._24_8_;
  local_7a8 = prim;
  for (uVar77 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar85); auVar123 = local_3c0, uVar77 != 0;
      uVar77 = (ulong)((uint)uVar77 & (uint)uVar77 + 0xf & uVar82)) {
    local_700 = auVar183._0_32_;
    local_6c0 = auVar188._0_32_;
    lVar86 = 0;
    for (uVar81 = uVar77; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      lVar86 = lVar86 + 1;
    }
    local_710 = (ulong)*(uint *)(local_7a8 + 2);
    pGVar11 = (context->scene->geometries).items[*(uint *)(local_7a8 + 2)].ptr;
    local_528 = (ulong)*(uint *)(local_7a8 + lVar86 * 4 + 6);
    uVar81 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                             (ulong)*(uint *)(local_7a8 + lVar86 * 4 + 6) *
                             pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    lVar83 = (long)pGVar11[1].intersectionFilterN * uVar81;
    lVar78 = (long)pGVar11[1].intersectionFilterN * (uVar81 + 1);
    lVar86 = *(long *)&pGVar11[1].time_range.upper;
    local_4f0 = *(undefined1 (*) [16])(lVar86 + lVar83);
    _local_3d0 = *(undefined1 (*) [16])(lVar86 + lVar78);
    uVar85 = *(undefined4 *)(lVar86 + 0xc + lVar83);
    auVar165._4_4_ = uVar85;
    auVar165._0_4_ = uVar85;
    auVar165._8_4_ = uVar85;
    auVar165._12_4_ = uVar85;
    local_280._16_4_ = uVar85;
    local_280._0_16_ = auVar165;
    local_280._20_4_ = uVar85;
    local_280._24_4_ = uVar85;
    local_280._28_4_ = uVar85;
    iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar92._8_4_ = 0xbeaaaaab;
    auVar92._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar92._12_4_ = 0xbeaaaaab;
    local_570 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar11[2].intersectionFilterN +
                                  uVar81 * (long)pGVar11[2].pointQueryFunc),local_4f0,auVar92);
    auVar113 = local_570;
    local_580 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar11[2].intersectionFilterN +
                                 (long)pGVar11[2].pointQueryFunc * (uVar81 + 1)),_local_3d0,auVar92)
    ;
    aVar4 = (ray->org).field_0;
    auVar140 = local_4f0;
    auVar15 = vsubps_avx(local_4f0,(undefined1  [16])aVar4);
    uVar85 = auVar15._0_4_;
    auVar114._4_4_ = uVar85;
    auVar114._0_4_ = uVar85;
    auVar114._8_4_ = uVar85;
    auVar114._12_4_ = uVar85;
    auVar20 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    aVar5 = (local_708->ray_space).vx.field_0;
    aVar6 = (local_708->ray_space).vy.field_0;
    fVar126 = (local_708->ray_space).vz.field_0.m128[0];
    fVar103 = (local_708->ray_space).vz.field_0.m128[1];
    fVar105 = (local_708->ray_space).vz.field_0.m128[2];
    fVar104 = (local_708->ray_space).vz.field_0.m128[3];
    auVar148._0_4_ = auVar15._0_4_ * fVar126;
    auVar148._4_4_ = auVar15._4_4_ * fVar103;
    auVar148._8_4_ = auVar15._8_4_ * fVar105;
    auVar148._12_4_ = auVar15._12_4_ * fVar104;
    auVar20 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar6,auVar20);
    auVar19 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar5,auVar114);
    auVar20 = vinsertps_avx(auVar19,auVar165,0x30);
    auVar16 = vsubps_avx(local_570,(undefined1  [16])aVar4);
    uVar85 = auVar16._0_4_;
    auVar149._4_4_ = uVar85;
    auVar149._0_4_ = uVar85;
    auVar149._8_4_ = uVar85;
    auVar149._12_4_ = uVar85;
    auVar15 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar186._0_4_ = auVar16._0_4_ * fVar126;
    auVar186._4_4_ = auVar16._4_4_ * fVar103;
    auVar186._8_4_ = auVar16._8_4_ * fVar105;
    auVar186._12_4_ = auVar16._12_4_ * fVar104;
    auVar15 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar15);
    auVar91 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar149);
    auVar15 = vblendps_avx(auVar91,local_570,8);
    auVar17 = vsubps_avx(local_580,(undefined1  [16])aVar4);
    auVar89 = local_580;
    uVar85 = auVar17._0_4_;
    auVar166._4_4_ = uVar85;
    auVar166._0_4_ = uVar85;
    auVar166._8_4_ = uVar85;
    auVar166._12_4_ = uVar85;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar150._0_4_ = auVar17._0_4_ * fVar126;
    auVar150._4_4_ = auVar17._4_4_ * fVar103;
    auVar150._8_4_ = auVar17._8_4_ * fVar105;
    auVar150._12_4_ = auVar17._12_4_ * fVar104;
    auVar16 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar6,auVar16);
    auVar90 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar166);
    auVar17 = vsubps_avx(_local_3d0,(undefined1  [16])aVar4);
    auVar16 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar198._0_4_ = auVar16._0_4_ * fVar126;
    auVar198._4_4_ = auVar16._4_4_ * fVar103;
    auVar198._8_4_ = auVar16._8_4_ * fVar105;
    auVar198._12_4_ = auVar16._12_4_ * fVar104;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar18 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar6,auVar16);
    auVar16 = vblendps_avx(auVar90,local_580,8);
    auVar151._0_4_ = auVar17._0_4_;
    auVar151._4_4_ = auVar151._0_4_;
    auVar151._8_4_ = auVar151._0_4_;
    auVar151._12_4_ = auVar151._0_4_;
    auVar127 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar151);
    fVar126 = *(float *)(lVar86 + 0xc + lVar78);
    auVar93._4_4_ = fVar126;
    auVar93._0_4_ = fVar126;
    auVar93._8_4_ = fVar126;
    auVar93._12_4_ = fVar126;
    fStack_290 = fVar126;
    _local_2a0 = auVar93;
    fStack_28c = fVar126;
    fStack_288 = fVar126;
    uStack_284 = fVar126;
    auVar17 = vinsertps_avx(auVar127,auVar93,0x30);
    auVar20 = vandps_avx(auVar20,local_2b0);
    auVar15 = vandps_avx(auVar15,local_2b0);
    auVar18 = vmaxps_avx(auVar20,auVar15);
    auVar20 = vandps_avx(auVar16,local_2b0);
    auVar15 = vandps_avx(auVar17,local_2b0);
    auVar20 = vmaxps_avx(auVar20,auVar15);
    auVar20 = vmaxps_avx(auVar18,auVar20);
    auVar15 = vmovshdup_avx(auVar20);
    auVar15 = vmaxss_avx(auVar15,auVar20);
    auVar20 = vshufpd_avx(auVar20,auVar20,1);
    auVar20 = vmaxss_avx(auVar20,auVar15);
    local_7b0 = (long)iVar10;
    lVar86 = local_7b0 * 0x44;
    auVar15 = vmovshdup_avx(auVar19);
    uVar87 = auVar15._0_8_;
    local_420._8_8_ = uVar87;
    local_420._0_8_ = uVar87;
    local_420._16_8_ = uVar87;
    local_420._24_8_ = uVar87;
    auVar16 = vmovshdup_avx(auVar91);
    uVar87 = auVar16._0_8_;
    local_740._8_8_ = uVar87;
    local_740._0_8_ = uVar87;
    local_740._16_8_ = uVar87;
    local_740._24_8_ = uVar87;
    auVar16 = vmovshdup_avx(auVar90);
    uVar87 = auVar16._0_8_;
    local_6e0._8_8_ = uVar87;
    local_6e0._0_8_ = uVar87;
    local_6e0._16_8_ = uVar87;
    local_6e0._24_8_ = uVar87;
    auVar16 = vmovshdup_avx(auVar127);
    local_5e0 = auVar16._0_8_;
    auVar7 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x908);
    uVar195 = auVar90._0_4_;
    local_6a0._4_4_ = uVar195;
    local_6a0._0_4_ = uVar195;
    local_6a0._8_4_ = uVar195;
    local_6a0._12_4_ = uVar195;
    local_6a0._16_4_ = uVar195;
    local_6a0._20_4_ = uVar195;
    local_6a0._24_4_ = uVar195;
    local_6a0._28_4_ = uVar195;
    fVar104 = *(float *)(bezier_basis0 + lVar86 + 0xd8c);
    fVar106 = *(float *)(bezier_basis0 + lVar86 + 0xd90);
    fVar107 = *(float *)(bezier_basis0 + lVar86 + 0xd94);
    fVar108 = *(float *)(bezier_basis0 + lVar86 + 0xd98);
    fVar109 = *(float *)(bezier_basis0 + lVar86 + 0xd9c);
    fVar110 = *(float *)(bezier_basis0 + lVar86 + 0xda0);
    fVar73 = *(float *)(bezier_basis0 + lVar86 + 0xda4);
    local_600 = auVar127._0_4_;
    auVar121._0_4_ = fVar104 * local_600;
    auVar121._4_4_ = fVar106 * local_600;
    auVar121._8_4_ = fVar107 * local_600;
    auVar121._12_4_ = fVar108 * local_600;
    auVar121._16_4_ = fVar109 * local_600;
    auVar121._20_4_ = fVar110 * local_600;
    auVar121._24_4_ = fVar73 * local_600;
    auVar121._28_4_ = 0;
    auVar17 = vfmadd231ps_fma(auVar121,auVar7,local_6a0);
    fVar103 = auVar16._0_4_;
    auVar133._0_4_ = fVar104 * fVar103;
    fVar105 = auVar16._4_4_;
    auVar133._4_4_ = fVar106 * fVar105;
    auVar133._8_4_ = fVar107 * fVar103;
    auVar133._12_4_ = fVar108 * fVar105;
    auVar133._16_4_ = fVar109 * fVar103;
    auVar133._20_4_ = fVar110 * fVar105;
    auVar133._24_4_ = fVar73 * fVar103;
    auVar133._28_4_ = 0;
    auVar16 = vfmadd231ps_fma(auVar133,auVar7,local_6e0);
    auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x484);
    uVar85 = auVar91._0_4_;
    local_680._4_4_ = uVar85;
    local_680._0_4_ = uVar85;
    local_680._8_4_ = uVar85;
    local_680._12_4_ = uVar85;
    local_680._16_4_ = uVar85;
    local_680._20_4_ = uVar85;
    local_680._24_4_ = uVar85;
    local_680._28_4_ = uVar85;
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar121,local_680);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar121,local_740);
    auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar86);
    uVar85 = auVar19._0_4_;
    local_5a0._4_4_ = uVar85;
    local_5a0._0_4_ = uVar85;
    local_5a0._8_4_ = uVar85;
    local_5a0._12_4_ = uVar85;
    local_5a0._16_4_ = uVar85;
    local_5a0._20_4_ = uVar85;
    local_5a0._24_4_ = uVar85;
    local_5a0._28_4_ = uVar85;
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar133,local_5a0);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar133,local_420);
    auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x908);
    fVar206 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar86 + 0xd8c);
    fVar207 = *(float *)(bezier_basis1 + lVar86 + 0xd90);
    fVar208 = *(float *)(bezier_basis1 + lVar86 + 0xd94);
    fVar209 = *(float *)(bezier_basis1 + lVar86 + 0xd98);
    fVar210 = *(float *)(bezier_basis1 + lVar86 + 0xd9c);
    fVar197 = *(float *)(bezier_basis1 + lVar86 + 0xda0);
    fVar199 = *(float *)(bezier_basis1 + lVar86 + 0xda4);
    auVar76 = *(undefined1 (*) [28])(bezier_basis1 + lVar86 + 0xd8c);
    fStack_5fc = local_600;
    fStack_5f8 = local_600;
    fStack_5f4 = local_600;
    fStack_5f0 = local_600;
    fStack_5ec = local_600;
    fStack_5e8 = local_600;
    fStack_5e4 = local_600;
    auVar182._4_4_ = fVar207 * local_600;
    auVar182._0_4_ = fVar206 * local_600;
    auVar182._8_4_ = fVar208 * local_600;
    auVar182._12_4_ = fVar209 * local_600;
    auVar182._16_4_ = fVar210 * local_600;
    auVar182._20_4_ = fVar197 * local_600;
    auVar182._24_4_ = fVar199 * local_600;
    auVar182._28_4_ = local_600;
    auVar18 = vfmadd231ps_fma(auVar182,auVar136,local_6a0);
    uStack_5d8 = local_5e0;
    uStack_5d0 = local_5e0;
    uStack_5c8 = local_5e0;
    auVar8._4_4_ = fVar207 * fVar105;
    auVar8._0_4_ = fVar206 * fVar103;
    auVar8._8_4_ = fVar208 * fVar103;
    auVar8._12_4_ = fVar209 * fVar105;
    auVar8._16_4_ = fVar210 * fVar103;
    auVar8._20_4_ = fVar197 * fVar105;
    auVar8._24_4_ = fVar199 * fVar103;
    auVar8._28_4_ = uVar195;
    auVar112 = vfmadd231ps_fma(auVar8,auVar136,local_6e0);
    auVar182 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x484);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar182,local_680);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar182,local_740);
    auVar8 = *(undefined1 (*) [32])(bezier_basis1 + lVar86);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar8,local_5a0);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar8,local_420);
    auVar95 = ZEXT1632(auVar18);
    auVar152 = ZEXT1632(auVar17);
    auVar101 = vsubps_avx(auVar95,auVar152);
    local_300 = ZEXT1632(auVar112);
    local_320 = ZEXT1632(auVar16);
    local_360 = vsubps_avx(local_300,local_320);
    auVar96._0_4_ = auVar16._0_4_ * auVar101._0_4_;
    auVar96._4_4_ = auVar16._4_4_ * auVar101._4_4_;
    auVar96._8_4_ = auVar16._8_4_ * auVar101._8_4_;
    auVar96._12_4_ = auVar16._12_4_ * auVar101._12_4_;
    auVar96._16_4_ = auVar101._16_4_ * 0.0;
    auVar96._20_4_ = auVar101._20_4_ * 0.0;
    auVar96._24_4_ = auVar101._24_4_ * 0.0;
    auVar96._28_4_ = 0;
    fVar185 = local_360._0_4_;
    auVar115._0_4_ = fVar185 * auVar17._0_4_;
    fVar189 = local_360._4_4_;
    auVar115._4_4_ = fVar189 * auVar17._4_4_;
    fVar190 = local_360._8_4_;
    auVar115._8_4_ = fVar190 * auVar17._8_4_;
    fVar191 = local_360._12_4_;
    auVar115._12_4_ = fVar191 * auVar17._12_4_;
    fVar192 = local_360._16_4_;
    auVar115._16_4_ = fVar192 * 0.0;
    fVar193 = local_360._20_4_;
    auVar115._20_4_ = fVar193 * 0.0;
    fVar194 = local_360._24_4_;
    auVar115._24_4_ = fVar194 * 0.0;
    auVar115._28_4_ = 0;
    auVar96 = vsubps_avx(auVar96,auVar115);
    auVar16 = vpermilps_avx(local_570,0xff);
    uVar87 = auVar16._0_8_;
    local_80._8_8_ = uVar87;
    local_80._0_8_ = uVar87;
    local_80._16_8_ = uVar87;
    local_80._24_8_ = uVar87;
    auVar16 = vpermilps_avx(local_580,0xff);
    local_a0._0_8_ = auVar16._0_8_;
    local_a0._8_8_ = local_a0._0_8_;
    local_a0._16_8_ = local_a0._0_8_;
    local_a0._24_8_ = local_a0._0_8_;
    auVar14._4_4_ = fVar126 * fVar106;
    auVar14._0_4_ = fVar126 * fVar104;
    auVar14._8_4_ = fVar126 * fVar107;
    auVar14._12_4_ = fVar126 * fVar108;
    auVar14._16_4_ = fVar126 * fVar109;
    auVar14._20_4_ = fVar126 * fVar110;
    auVar14._24_4_ = fVar126 * fVar73;
    auVar14._28_4_ = auVar15._4_4_;
    auVar15 = vfmadd231ps_fma(auVar14,auVar7,local_a0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar121,local_80);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar133,local_280);
    auVar13._4_4_ = fVar126 * fVar207;
    auVar13._0_4_ = fVar126 * fVar206;
    auVar13._8_4_ = fVar126 * fVar208;
    auVar13._12_4_ = fVar126 * fVar209;
    auVar13._16_4_ = fVar126 * fVar210;
    auVar13._20_4_ = fVar126 * fVar197;
    auVar13._24_4_ = fVar126 * fVar199;
    auVar13._28_4_ = auVar133._28_4_;
    auVar15 = vfmadd231ps_fma(auVar13,auVar136,local_a0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar182,local_80);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar8,local_280);
    auVar21._4_4_ = fVar189 * fVar189;
    auVar21._0_4_ = fVar185 * fVar185;
    auVar21._8_4_ = fVar190 * fVar190;
    auVar21._12_4_ = fVar191 * fVar191;
    auVar21._16_4_ = fVar192 * fVar192;
    auVar21._20_4_ = fVar193 * fVar193;
    auVar21._24_4_ = fVar194 * fVar194;
    auVar21._28_4_ = fVar126;
    auVar15 = vfmadd231ps_fma(auVar21,auVar101,auVar101);
    auVar14 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar22._4_4_ = auVar15._4_4_ * auVar14._4_4_ * auVar14._4_4_;
    auVar22._0_4_ = auVar15._0_4_ * auVar14._0_4_ * auVar14._0_4_;
    auVar22._8_4_ = auVar15._8_4_ * auVar14._8_4_ * auVar14._8_4_;
    auVar22._12_4_ = auVar15._12_4_ * auVar14._12_4_ * auVar14._12_4_;
    auVar22._16_4_ = auVar14._16_4_ * auVar14._16_4_ * 0.0;
    auVar22._20_4_ = auVar14._20_4_ * auVar14._20_4_ * 0.0;
    auVar22._24_4_ = auVar14._24_4_ * auVar14._24_4_ * 0.0;
    auVar22._28_4_ = auVar14._28_4_;
    auVar23._4_4_ = auVar96._4_4_ * auVar96._4_4_;
    auVar23._0_4_ = auVar96._0_4_ * auVar96._0_4_;
    auVar23._8_4_ = auVar96._8_4_ * auVar96._8_4_;
    auVar23._12_4_ = auVar96._12_4_ * auVar96._12_4_;
    auVar23._16_4_ = auVar96._16_4_ * auVar96._16_4_;
    auVar23._20_4_ = auVar96._20_4_ * auVar96._20_4_;
    auVar23._24_4_ = auVar96._24_4_ * auVar96._24_4_;
    auVar23._28_4_ = auVar96._28_4_;
    auVar14 = vcmpps_avx(auVar23,auVar22,2);
    fVar126 = auVar20._0_4_ * 4.7683716e-07;
    local_760._0_16_ = ZEXT416((uint)fVar126);
    auVar116._0_4_ = (float)iVar10;
    local_3c0._4_12_ = auVar127._4_12_;
    local_3c0._0_4_ = auVar116._0_4_;
    local_3c0._16_16_ = auVar123._16_16_;
    auVar116._4_4_ = auVar116._0_4_;
    auVar116._8_4_ = auVar116._0_4_;
    auVar116._12_4_ = auVar116._0_4_;
    auVar116._16_4_ = auVar116._0_4_;
    auVar116._20_4_ = auVar116._0_4_;
    auVar116._24_4_ = auVar116._0_4_;
    auVar116._28_4_ = auVar116._0_4_;
    auVar123 = vcmpps_avx(_DAT_01f7b060,auVar116,1);
    auVar15 = vpermilps_avx(auVar19,0xaa);
    uVar87 = auVar15._0_8_;
    local_400._8_8_ = uVar87;
    local_400._0_8_ = uVar87;
    local_400._16_8_ = uVar87;
    local_400._24_8_ = uVar87;
    auVar20 = vpermilps_avx(auVar91,0xaa);
    uVar87 = auVar20._0_8_;
    local_2e0._8_8_ = uVar87;
    local_2e0._0_8_ = uVar87;
    local_2e0._16_8_ = uVar87;
    local_2e0._24_8_ = uVar87;
    auVar20 = vpermilps_avx(auVar90,0xaa);
    uVar87 = auVar20._0_8_;
    local_c0._8_8_ = uVar87;
    local_c0._0_8_ = uVar87;
    local_c0._16_8_ = uVar87;
    local_c0._24_8_ = uVar87;
    auVar20 = vshufps_avx(auVar127,auVar127,0xaa);
    uVar87 = auVar20._0_8_;
    auVar96 = auVar123 & auVar14;
    local_620._0_16_ = vpermilps_avx((undefined1  [16])aVar4,0xff);
    auVar13 = local_620;
    fVar206 = fVar103;
    fVar207 = fVar105;
    fVar208 = fVar103;
    fVar209 = fVar105;
    fVar210 = fVar103;
    uVar200 = uVar87;
    uStack_5b0 = uVar87;
    uStack_5a8 = uVar87;
    local_620 = auVar13;
    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0x7f,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar96 >> 0xbf,0) == '\0') &&
        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f]) {
LAB_0114c388:
      auVar204 = ZEXT3264(local_6e0);
      auVar188 = ZEXT3264(local_6c0);
      auVar183 = ZEXT3264(local_700);
      auVar205 = ZEXT3264(local_6a0);
      bVar84 = 0;
      auVar171 = ZEXT3264(CONCAT428(local_600,
                                    CONCAT424(local_600,
                                              CONCAT420(local_600,
                                                        CONCAT416(local_600,
                                                                  CONCAT412(local_600,
                                                                            CONCAT48(local_600,
                                                                                     CONCAT44(
                                                  local_600,local_600))))))));
      auVar175 = ZEXT3264(local_680);
      auVar145 = ZEXT3264(local_5a0);
      local_580 = auVar89;
      local_570 = auVar113;
      local_4f0 = auVar140;
    }
    else {
      local_340 = vandps_avx(auVar123,auVar14);
      uStack_5b8 = uVar87;
      local_5c0 = uVar87;
      local_480._0_4_ = auVar76._0_4_;
      local_480._4_4_ = auVar76._4_4_;
      fStack_478 = auVar76._8_4_;
      fStack_474 = auVar76._12_4_;
      fStack_470 = auVar76._16_4_;
      fStack_46c = auVar76._20_4_;
      fStack_468 = auVar76._24_4_;
      fVar197 = auVar20._0_4_;
      fVar199 = auVar20._4_4_;
      auVar123._4_4_ = fVar199 * (float)local_480._4_4_;
      auVar123._0_4_ = fVar197 * (float)local_480._0_4_;
      auVar123._8_4_ = fVar197 * fStack_478;
      auVar123._12_4_ = fVar199 * fStack_474;
      auVar123._16_4_ = fVar197 * fStack_470;
      auVar123._20_4_ = fVar199 * fStack_46c;
      auVar123._24_4_ = fVar197 * fStack_468;
      auVar123._28_4_ = local_340._28_4_;
      auVar20 = vfmadd213ps_fma(auVar136,local_c0,auVar123);
      auVar20 = vfmadd213ps_fma(auVar182,local_2e0,ZEXT1632(auVar20));
      auVar20 = vfmadd213ps_fma(auVar8,local_400,ZEXT1632(auVar20));
      auVar97._0_4_ = fVar197 * fVar104;
      auVar97._4_4_ = fVar199 * fVar106;
      auVar97._8_4_ = fVar197 * fVar107;
      auVar97._12_4_ = fVar199 * fVar108;
      auVar97._16_4_ = fVar197 * fVar109;
      auVar97._20_4_ = fVar199 * fVar110;
      auVar97._24_4_ = fVar197 * fVar73;
      auVar97._28_4_ = 0;
      auVar18 = vfmadd213ps_fma(auVar7,local_c0,auVar97);
      auVar18 = vfmadd213ps_fma(auVar121,local_2e0,ZEXT1632(auVar18));
      auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x1210);
      auVar7 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x1694);
      _local_480 = auVar101;
      auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x1b18);
      fVar104 = *(float *)(bezier_basis0 + lVar86 + 0x1f9c);
      fVar106 = *(float *)(bezier_basis0 + lVar86 + 0x1fa0);
      fVar107 = *(float *)(bezier_basis0 + lVar86 + 0x1fa4);
      fVar108 = *(float *)(bezier_basis0 + lVar86 + 0x1fa8);
      fVar109 = *(float *)(bezier_basis0 + lVar86 + 0x1fac);
      fVar110 = *(float *)(bezier_basis0 + lVar86 + 0x1fb0);
      fVar73 = *(float *)(bezier_basis0 + lVar86 + 0x1fb4);
      auVar132._0_4_ = local_600 * fVar104;
      auVar132._4_4_ = local_600 * fVar106;
      auVar132._8_4_ = local_600 * fVar107;
      auVar132._12_4_ = local_600 * fVar108;
      auVar132._16_4_ = local_600 * fVar109;
      auVar132._20_4_ = local_600 * fVar110;
      auVar132._24_4_ = local_600 * fVar73;
      auVar132._28_4_ = 0;
      auVar160._0_4_ = fVar103 * fVar104;
      auVar160._4_4_ = fVar105 * fVar106;
      auVar160._8_4_ = fVar103 * fVar107;
      auVar160._12_4_ = fVar105 * fVar108;
      auVar160._16_4_ = fVar103 * fVar109;
      auVar160._20_4_ = fVar105 * fVar110;
      auVar160._24_4_ = fVar103 * fVar73;
      auVar160._28_4_ = 0;
      auVar136._4_4_ = fVar199 * fVar106;
      auVar136._0_4_ = fVar197 * fVar104;
      auVar136._8_4_ = fVar197 * fVar107;
      auVar136._12_4_ = fVar199 * fVar108;
      auVar136._16_4_ = fVar197 * fVar109;
      auVar136._20_4_ = fVar199 * fVar110;
      auVar136._24_4_ = fVar197 * fVar73;
      auVar136._28_4_ = *(undefined4 *)(bezier_basis0 + lVar86 + 0x1fb8);
      auVar19 = vfmadd231ps_fma(auVar132,auVar121,local_6a0);
      auVar91 = vfmadd231ps_fma(auVar160,auVar121,local_6e0);
      auVar90 = vfmadd231ps_fma(auVar136,local_c0,auVar121);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar7,local_680);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar7,local_740);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_2e0,auVar7);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar123,local_5a0);
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar123,local_420);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_400,auVar123);
      fVar104 = *(float *)(bezier_basis1 + lVar86 + 0x1f9c);
      fVar106 = *(float *)(bezier_basis1 + lVar86 + 0x1fa0);
      fVar107 = *(float *)(bezier_basis1 + lVar86 + 0x1fa4);
      fVar108 = *(float *)(bezier_basis1 + lVar86 + 0x1fa8);
      fVar109 = *(float *)(bezier_basis1 + lVar86 + 0x1fac);
      fVar110 = *(float *)(bezier_basis1 + lVar86 + 0x1fb0);
      fVar73 = *(float *)(bezier_basis1 + lVar86 + 0x1fb4);
      auVar7._4_4_ = local_600 * fVar106;
      auVar7._0_4_ = local_600 * fVar104;
      auVar7._8_4_ = local_600 * fVar107;
      auVar7._12_4_ = local_600 * fVar108;
      auVar7._16_4_ = local_600 * fVar109;
      auVar7._20_4_ = local_600 * fVar110;
      auVar7._24_4_ = local_600 * fVar73;
      auVar7._28_4_ = auVar121._28_4_;
      auVar24._4_4_ = fVar105 * fVar106;
      auVar24._0_4_ = fVar103 * fVar104;
      auVar24._8_4_ = fVar103 * fVar107;
      auVar24._12_4_ = fVar105 * fVar108;
      auVar24._16_4_ = fVar103 * fVar109;
      auVar24._20_4_ = fVar105 * fVar110;
      auVar24._24_4_ = fVar103 * fVar73;
      auVar24._28_4_ = local_600;
      auVar25._4_4_ = fVar106 * fVar199;
      auVar25._0_4_ = fVar104 * fVar197;
      auVar25._8_4_ = fVar107 * fVar197;
      auVar25._12_4_ = fVar108 * fVar199;
      auVar25._16_4_ = fVar109 * fVar197;
      auVar25._20_4_ = fVar110 * fVar199;
      auVar25._24_4_ = fVar73 * fVar197;
      auVar25._28_4_ = auVar15._4_4_;
      auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x1b18);
      auVar127 = vfmadd231ps_fma(auVar7,auVar123,local_6a0);
      auVar112 = vfmadd231ps_fma(auVar24,auVar123,local_6e0);
      auVar147 = vfmadd231ps_fma(auVar25,local_c0,auVar123);
      auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x1694);
      auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar123,local_680);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar123,local_740);
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_2e0,auVar123);
      auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x1210);
      auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar123,local_5a0);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar123,local_420);
      auVar117._8_4_ = 0x7fffffff;
      auVar117._0_8_ = 0x7fffffff7fffffff;
      auVar117._12_4_ = 0x7fffffff;
      auVar117._16_4_ = 0x7fffffff;
      auVar117._20_4_ = 0x7fffffff;
      auVar117._24_4_ = 0x7fffffff;
      auVar117._28_4_ = 0x7fffffff;
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_400,auVar123);
      auVar123 = vandps_avx(ZEXT1632(auVar19),auVar117);
      auVar7 = vandps_avx(ZEXT1632(auVar91),auVar117);
      auVar7 = vmaxps_avx(auVar123,auVar7);
      auVar123 = vandps_avx(ZEXT1632(auVar90),auVar117);
      auVar123 = vmaxps_avx(auVar7,auVar123);
      auVar178._4_4_ = fVar126;
      auVar178._0_4_ = fVar126;
      auVar178._8_4_ = fVar126;
      auVar178._12_4_ = fVar126;
      auVar178._16_4_ = fVar126;
      auVar178._20_4_ = fVar126;
      auVar178._24_4_ = fVar126;
      auVar178._28_4_ = fVar126;
      auVar123 = vcmpps_avx(auVar123,auVar178,1);
      auVar121 = vblendvps_avx(ZEXT1632(auVar19),auVar101,auVar123);
      auVar136 = vblendvps_avx(ZEXT1632(auVar91),local_360,auVar123);
      auVar123 = vandps_avx(ZEXT1632(auVar127),auVar117);
      auVar7 = vandps_avx(ZEXT1632(auVar112),auVar117);
      auVar7 = vmaxps_avx(auVar123,auVar7);
      auVar123 = vandps_avx(ZEXT1632(auVar147),auVar117);
      auVar123 = vmaxps_avx(auVar7,auVar123);
      auVar182 = vcmpps_avx(auVar123,auVar178,1);
      auVar123 = vblendvps_avx(ZEXT1632(auVar127),auVar101,auVar182);
      auVar7 = vblendvps_avx(ZEXT1632(auVar112),local_360,auVar182);
      auVar18 = vfmadd213ps_fma(auVar133,local_400,ZEXT1632(auVar18));
      auVar19 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar136,auVar136);
      auVar133 = vrsqrtps_avx(ZEXT1632(auVar19));
      fVar126 = auVar133._0_4_;
      fVar104 = auVar133._4_4_;
      fVar106 = auVar133._8_4_;
      fVar107 = auVar133._12_4_;
      fVar108 = auVar133._16_4_;
      fVar109 = auVar133._20_4_;
      fVar110 = auVar133._24_4_;
      auVar101._4_4_ = fVar104 * fVar104 * fVar104 * auVar19._4_4_ * -0.5;
      auVar101._0_4_ = fVar126 * fVar126 * fVar126 * auVar19._0_4_ * -0.5;
      auVar101._8_4_ = fVar106 * fVar106 * fVar106 * auVar19._8_4_ * -0.5;
      auVar101._12_4_ = fVar107 * fVar107 * fVar107 * auVar19._12_4_ * -0.5;
      auVar101._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
      auVar101._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
      auVar101._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
      auVar101._28_4_ = 0;
      auVar173._8_4_ = 0x3fc00000;
      auVar173._0_8_ = 0x3fc000003fc00000;
      auVar173._12_4_ = 0x3fc00000;
      auVar173._16_4_ = 0x3fc00000;
      auVar173._20_4_ = 0x3fc00000;
      auVar173._24_4_ = 0x3fc00000;
      auVar173._28_4_ = 0x3fc00000;
      auVar19 = vfmadd231ps_fma(auVar101,auVar173,auVar133);
      fVar126 = auVar19._0_4_;
      fVar104 = auVar19._4_4_;
      auVar26._4_4_ = auVar136._4_4_ * fVar104;
      auVar26._0_4_ = auVar136._0_4_ * fVar126;
      fVar106 = auVar19._8_4_;
      auVar26._8_4_ = auVar136._8_4_ * fVar106;
      fVar107 = auVar19._12_4_;
      auVar26._12_4_ = auVar136._12_4_ * fVar107;
      auVar26._16_4_ = auVar136._16_4_ * 0.0;
      auVar26._20_4_ = auVar136._20_4_ * 0.0;
      auVar26._24_4_ = auVar136._24_4_ * 0.0;
      auVar26._28_4_ = auVar133._28_4_;
      auVar27._4_4_ = -auVar121._4_4_ * fVar104;
      auVar27._0_4_ = -auVar121._0_4_ * fVar126;
      auVar27._8_4_ = -auVar121._8_4_ * fVar106;
      auVar27._12_4_ = -auVar121._12_4_ * fVar107;
      auVar27._16_4_ = -auVar121._16_4_ * 0.0;
      auVar27._20_4_ = -auVar121._20_4_ * 0.0;
      auVar27._24_4_ = -auVar121._24_4_ * 0.0;
      auVar27._28_4_ = auVar182._28_4_;
      auVar19 = vfmadd213ps_fma(auVar123,auVar123,ZEXT832(0) << 0x20);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar7,auVar7);
      auVar121 = vrsqrtps_avx(ZEXT1632(auVar19));
      auVar28._28_4_ = auVar15._4_4_;
      auVar28._0_28_ =
           ZEXT1628(CONCAT412(fVar107 * 0.0,
                              CONCAT48(fVar106 * 0.0,CONCAT44(fVar104 * 0.0,fVar126 * 0.0))));
      fVar126 = auVar121._0_4_;
      fVar104 = auVar121._4_4_;
      fVar106 = auVar121._8_4_;
      fVar107 = auVar121._12_4_;
      fVar108 = auVar121._16_4_;
      fVar109 = auVar121._20_4_;
      fVar110 = auVar121._24_4_;
      auVar29._4_4_ = fVar104 * fVar104 * fVar104 * auVar19._4_4_ * -0.5;
      auVar29._0_4_ = fVar126 * fVar126 * fVar126 * auVar19._0_4_ * -0.5;
      auVar29._8_4_ = fVar106 * fVar106 * fVar106 * auVar19._8_4_ * -0.5;
      auVar29._12_4_ = fVar107 * fVar107 * fVar107 * auVar19._12_4_ * -0.5;
      auVar29._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
      auVar29._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
      auVar29._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
      auVar29._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar29,auVar173,auVar121);
      fVar126 = auVar15._0_4_;
      fVar104 = auVar15._4_4_;
      auVar30._4_4_ = auVar7._4_4_ * fVar104;
      auVar30._0_4_ = auVar7._0_4_ * fVar126;
      fVar106 = auVar15._8_4_;
      auVar30._8_4_ = auVar7._8_4_ * fVar106;
      fVar107 = auVar15._12_4_;
      auVar30._12_4_ = auVar7._12_4_ * fVar107;
      auVar30._16_4_ = auVar7._16_4_ * 0.0;
      auVar30._20_4_ = auVar7._20_4_ * 0.0;
      auVar30._24_4_ = auVar7._24_4_ * 0.0;
      auVar30._28_4_ = 0;
      auVar31._4_4_ = fVar104 * -auVar123._4_4_;
      auVar31._0_4_ = fVar126 * -auVar123._0_4_;
      auVar31._8_4_ = fVar106 * -auVar123._8_4_;
      auVar31._12_4_ = fVar107 * -auVar123._12_4_;
      auVar31._16_4_ = -auVar123._16_4_ * 0.0;
      auVar31._20_4_ = -auVar123._20_4_ * 0.0;
      auVar31._24_4_ = -auVar123._24_4_ * 0.0;
      auVar31._28_4_ = 0x3fc00000;
      auVar32._28_4_ = auVar123._28_4_ ^ 0x80000000;
      auVar32._0_28_ =
           ZEXT1628(CONCAT412(fVar107 * 0.0,
                              CONCAT48(fVar106 * 0.0,CONCAT44(fVar104 * 0.0,fVar126 * 0.0))));
      auVar15 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar16),auVar152);
      auVar123 = ZEXT1632(auVar16);
      auVar19 = vfmadd213ps_fma(auVar27,auVar123,local_320);
      auVar91 = vfmadd213ps_fma(auVar28,auVar123,ZEXT1632(auVar18));
      auVar112 = vfnmadd213ps_fma(auVar26,auVar123,auVar152);
      auVar90 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar17),auVar95);
      auVar147 = vfnmadd213ps_fma(auVar27,auVar123,local_320);
      auVar123 = ZEXT1632(auVar17);
      auVar127 = vfmadd213ps_fma(auVar31,auVar123,local_300);
      local_460 = ZEXT1632(auVar16);
      auVar146 = vfnmadd231ps_fma(ZEXT1632(auVar18),local_460,auVar28);
      auVar16 = vfmadd213ps_fma(auVar32,auVar123,ZEXT1632(auVar20));
      auVar88 = vfnmadd213ps_fma(auVar30,auVar123,auVar95);
      auVar111 = vfnmadd213ps_fma(auVar31,auVar123,local_300);
      local_440 = ZEXT1632(auVar17);
      auVar155 = vfnmadd231ps_fma(ZEXT1632(auVar20),local_440,auVar32);
      auVar123 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar147));
      auVar7 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar146));
      auVar95._4_4_ = auVar146._4_4_ * auVar123._4_4_;
      auVar95._0_4_ = auVar146._0_4_ * auVar123._0_4_;
      auVar95._8_4_ = auVar146._8_4_ * auVar123._8_4_;
      auVar95._12_4_ = auVar146._12_4_ * auVar123._12_4_;
      auVar95._16_4_ = auVar123._16_4_ * 0.0;
      auVar95._20_4_ = auVar123._20_4_ * 0.0;
      auVar95._24_4_ = auVar123._24_4_ * 0.0;
      auVar95._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar147),auVar7);
      auVar152._4_4_ = auVar112._4_4_ * auVar7._4_4_;
      auVar152._0_4_ = auVar112._0_4_ * auVar7._0_4_;
      auVar152._8_4_ = auVar112._8_4_ * auVar7._8_4_;
      auVar152._12_4_ = auVar112._12_4_ * auVar7._12_4_;
      auVar152._16_4_ = auVar7._16_4_ * 0.0;
      auVar152._20_4_ = auVar7._20_4_ * 0.0;
      auVar152._24_4_ = auVar7._24_4_ * 0.0;
      auVar152._28_4_ = auVar7._28_4_;
      auVar136 = ZEXT1632(auVar112);
      auVar7 = vsubps_avx(ZEXT1632(auVar90),auVar136);
      auVar20 = vfmsub231ps_fma(auVar152,ZEXT1632(auVar146),auVar7);
      auVar33._4_4_ = auVar7._4_4_ * auVar147._4_4_;
      auVar33._0_4_ = auVar7._0_4_ * auVar147._0_4_;
      auVar33._8_4_ = auVar7._8_4_ * auVar147._8_4_;
      auVar33._12_4_ = auVar7._12_4_ * auVar147._12_4_;
      auVar33._16_4_ = auVar7._16_4_ * 0.0;
      auVar33._20_4_ = auVar7._20_4_ * 0.0;
      auVar33._24_4_ = auVar7._24_4_ * 0.0;
      auVar33._28_4_ = auVar7._28_4_;
      auVar18 = vfmsub231ps_fma(auVar33,auVar136,auVar123);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar14 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
      local_7a0 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar15),auVar14);
      local_520 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar19),auVar14);
      auVar123 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar91),auVar14);
      auVar7 = vblendvps_avx(auVar136,ZEXT1632(auVar90),auVar14);
      auVar121 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar127),auVar14);
      auVar133 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar16),auVar14);
      auVar136 = vblendvps_avx(ZEXT1632(auVar90),auVar136,auVar14);
      auVar182 = vblendvps_avx(ZEXT1632(auVar127),ZEXT1632(auVar147),auVar14);
      auVar20 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
      local_780 = ZEXT1632(auVar20);
      auVar8 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar146),auVar14);
      auVar101 = vsubps_avx(auVar136,local_7a0);
      auVar182 = vsubps_avx(auVar182,local_520);
      auVar96 = vsubps_avx(auVar8,auVar123);
      auVar13 = vsubps_avx(local_7a0,auVar7);
      auVar21 = vsubps_avx(local_520,auVar121);
      auVar22 = vsubps_avx(auVar123,auVar133);
      auVar34._4_4_ = auVar96._4_4_ * local_7a0._4_4_;
      auVar34._0_4_ = auVar96._0_4_ * local_7a0._0_4_;
      auVar34._8_4_ = auVar96._8_4_ * local_7a0._8_4_;
      auVar34._12_4_ = auVar96._12_4_ * local_7a0._12_4_;
      auVar34._16_4_ = auVar96._16_4_ * local_7a0._16_4_;
      auVar34._20_4_ = auVar96._20_4_ * local_7a0._20_4_;
      auVar34._24_4_ = auVar96._24_4_ * local_7a0._24_4_;
      auVar34._28_4_ = auVar8._28_4_;
      auVar15 = vfmsub231ps_fma(auVar34,auVar123,auVar101);
      auVar35._4_4_ = auVar101._4_4_ * local_520._4_4_;
      auVar35._0_4_ = auVar101._0_4_ * local_520._0_4_;
      auVar35._8_4_ = auVar101._8_4_ * local_520._8_4_;
      auVar35._12_4_ = auVar101._12_4_ * local_520._12_4_;
      auVar35._16_4_ = auVar101._16_4_ * local_520._16_4_;
      auVar35._20_4_ = auVar101._20_4_ * local_520._20_4_;
      auVar35._24_4_ = auVar101._24_4_ * local_520._24_4_;
      auVar35._28_4_ = auVar136._28_4_;
      auVar16 = vfmsub231ps_fma(auVar35,local_7a0,auVar182);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar98._0_4_ = auVar123._0_4_ * auVar182._0_4_;
      auVar98._4_4_ = auVar123._4_4_ * auVar182._4_4_;
      auVar98._8_4_ = auVar123._8_4_ * auVar182._8_4_;
      auVar98._12_4_ = auVar123._12_4_ * auVar182._12_4_;
      auVar98._16_4_ = auVar123._16_4_ * auVar182._16_4_;
      auVar98._20_4_ = auVar123._20_4_ * auVar182._20_4_;
      auVar98._24_4_ = auVar123._24_4_ * auVar182._24_4_;
      auVar98._28_4_ = 0;
      auVar16 = vfmsub231ps_fma(auVar98,local_520,auVar96);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
      auVar99._0_4_ = auVar22._0_4_ * auVar7._0_4_;
      auVar99._4_4_ = auVar22._4_4_ * auVar7._4_4_;
      auVar99._8_4_ = auVar22._8_4_ * auVar7._8_4_;
      auVar99._12_4_ = auVar22._12_4_ * auVar7._12_4_;
      auVar99._16_4_ = auVar22._16_4_ * auVar7._16_4_;
      auVar99._20_4_ = auVar22._20_4_ * auVar7._20_4_;
      auVar99._24_4_ = auVar22._24_4_ * auVar7._24_4_;
      auVar99._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar99,auVar13,auVar133);
      auVar118._0_4_ = auVar21._0_4_ * auVar133._0_4_;
      auVar118._4_4_ = auVar21._4_4_ * auVar133._4_4_;
      auVar118._8_4_ = auVar21._8_4_ * auVar133._8_4_;
      auVar118._12_4_ = auVar21._12_4_ * auVar133._12_4_;
      auVar118._16_4_ = auVar21._16_4_ * auVar133._16_4_;
      auVar118._20_4_ = auVar21._20_4_ * auVar133._20_4_;
      auVar118._24_4_ = auVar21._24_4_ * auVar133._24_4_;
      auVar118._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar118,auVar121,auVar22);
      auVar36._4_4_ = auVar13._4_4_ * auVar121._4_4_;
      auVar36._0_4_ = auVar13._0_4_ * auVar121._0_4_;
      auVar36._8_4_ = auVar13._8_4_ * auVar121._8_4_;
      auVar36._12_4_ = auVar13._12_4_ * auVar121._12_4_;
      auVar36._16_4_ = auVar13._16_4_ * auVar121._16_4_;
      auVar36._20_4_ = auVar13._20_4_ * auVar121._20_4_;
      auVar36._24_4_ = auVar13._24_4_ * auVar121._24_4_;
      auVar36._28_4_ = auVar121._28_4_;
      auVar18 = vfmsub231ps_fma(auVar36,auVar21,auVar7);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar121 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
      auVar133 = ZEXT832(0) << 0x20;
      auVar121 = vcmpps_avx(auVar121,auVar133,2);
      auVar15 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
      auVar20 = vpand_avx(auVar15,auVar20);
      auVar121 = vpmovsxwd_avx2(auVar20);
      if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0x7f,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0xbf,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar121[0x1f]) {
LAB_0114d4d0:
        auVar154._8_8_ = uStack_498;
        auVar154._0_8_ = local_4a0;
        auVar154._16_8_ = uStack_490;
        auVar154._24_8_ = uStack_488;
        auVar125 = ZEXT3264(local_4c0);
        auVar138 = ZEXT3264(local_4e0);
      }
      else {
        auVar119._0_4_ = auVar22._0_4_ * auVar182._0_4_;
        auVar119._4_4_ = auVar22._4_4_ * auVar182._4_4_;
        auVar119._8_4_ = auVar22._8_4_ * auVar182._8_4_;
        auVar119._12_4_ = auVar22._12_4_ * auVar182._12_4_;
        auVar119._16_4_ = auVar22._16_4_ * auVar182._16_4_;
        auVar119._20_4_ = auVar22._20_4_ * auVar182._20_4_;
        auVar119._24_4_ = auVar22._24_4_ * auVar182._24_4_;
        auVar119._28_4_ = 0;
        auVar91 = vfmsub231ps_fma(auVar119,auVar21,auVar96);
        auVar37._4_4_ = auVar96._4_4_ * auVar13._4_4_;
        auVar37._0_4_ = auVar96._0_4_ * auVar13._0_4_;
        auVar37._8_4_ = auVar96._8_4_ * auVar13._8_4_;
        auVar37._12_4_ = auVar96._12_4_ * auVar13._12_4_;
        auVar37._16_4_ = auVar96._16_4_ * auVar13._16_4_;
        auVar37._20_4_ = auVar96._20_4_ * auVar13._20_4_;
        auVar37._24_4_ = auVar96._24_4_ * auVar13._24_4_;
        auVar37._28_4_ = auVar7._28_4_;
        auVar19 = vfmsub231ps_fma(auVar37,auVar101,auVar22);
        auVar38._4_4_ = auVar101._4_4_ * auVar21._4_4_;
        auVar38._0_4_ = auVar101._0_4_ * auVar21._0_4_;
        auVar38._8_4_ = auVar101._8_4_ * auVar21._8_4_;
        auVar38._12_4_ = auVar101._12_4_ * auVar21._12_4_;
        auVar38._16_4_ = auVar101._16_4_ * auVar21._16_4_;
        auVar38._20_4_ = auVar101._20_4_ * auVar21._20_4_;
        auVar38._24_4_ = auVar101._24_4_ * auVar21._24_4_;
        auVar38._28_4_ = auVar101._28_4_;
        auVar90 = vfmsub231ps_fma(auVar38,auVar13,auVar182);
        auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar19),ZEXT1632(auVar90));
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar91),auVar133);
        auVar7 = vrcpps_avx(ZEXT1632(auVar18));
        auVar187._8_4_ = 0x3f800000;
        auVar187._0_8_ = 0x3f8000003f800000;
        auVar187._12_4_ = 0x3f800000;
        auVar187._16_4_ = 0x3f800000;
        auVar187._20_4_ = 0x3f800000;
        auVar187._24_4_ = 0x3f800000;
        auVar187._28_4_ = 0x3f800000;
        auVar15 = vfnmadd213ps_fma(auVar7,ZEXT1632(auVar18),auVar187);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar7,auVar7);
        auVar39._4_4_ = auVar90._4_4_ * auVar123._4_4_;
        auVar39._0_4_ = auVar90._0_4_ * auVar123._0_4_;
        auVar39._8_4_ = auVar90._8_4_ * auVar123._8_4_;
        auVar39._12_4_ = auVar90._12_4_ * auVar123._12_4_;
        auVar39._16_4_ = auVar123._16_4_ * 0.0;
        auVar39._20_4_ = auVar123._20_4_ * 0.0;
        auVar39._24_4_ = auVar123._24_4_ * 0.0;
        auVar39._28_4_ = auVar123._28_4_;
        auVar19 = vfmadd231ps_fma(auVar39,ZEXT1632(auVar19),local_520);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT1632(auVar91),local_7a0);
        fVar104 = auVar15._0_4_;
        fVar106 = auVar15._4_4_;
        fVar107 = auVar15._8_4_;
        fVar108 = auVar15._12_4_;
        auVar40._28_4_ = auVar182._28_4_;
        auVar40._0_28_ =
             ZEXT1628(CONCAT412(fVar108 * auVar19._12_4_,
                                CONCAT48(fVar107 * auVar19._8_4_,
                                         CONCAT44(fVar106 * auVar19._4_4_,fVar104 * auVar19._0_4_)))
                     );
        auVar120._8_8_ = local_620._0_8_;
        auVar120._0_8_ = local_620._0_8_;
        auVar120._16_8_ = local_620._0_8_;
        auVar120._24_8_ = local_620._0_8_;
        fVar126 = ray->tfar;
        auVar153._4_4_ = fVar126;
        auVar153._0_4_ = fVar126;
        auVar153._8_4_ = fVar126;
        auVar153._12_4_ = fVar126;
        auVar153._16_4_ = fVar126;
        auVar153._20_4_ = fVar126;
        auVar153._24_4_ = fVar126;
        auVar153._28_4_ = fVar126;
        auVar123 = vcmpps_avx(auVar120,auVar40,2);
        auVar7 = vcmpps_avx(auVar40,auVar153,2);
        auVar123 = vandps_avx(auVar7,auVar123);
        auVar15 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
        auVar20 = vpand_avx(auVar20,auVar15);
        auVar123 = vpmovsxwd_avx2(auVar20);
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0x7f,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar123 >> 0xbf,0) == '\0') &&
            (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar123[0x1f]) goto LAB_0114d4d0;
        auVar123 = vcmpps_avx(auVar133,ZEXT1632(auVar18),4);
        auVar15 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
        auVar20 = vpand_avx(auVar20,auVar15);
        auVar123 = vpmovsxwd_avx2(auVar20);
        auVar154._8_8_ = uStack_498;
        auVar154._0_8_ = local_4a0;
        auVar154._16_8_ = uStack_490;
        auVar154._24_8_ = uStack_488;
        auVar125 = ZEXT3264(local_4c0);
        auVar138 = ZEXT3264(local_4e0);
        if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar123 >> 0x7f,0) != '\0') ||
              (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar123 >> 0xbf,0) != '\0') ||
            (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar123[0x1f] < '\0') {
          auVar121 = ZEXT1632(CONCAT412(fVar108 * auVar16._12_4_,
                                        CONCAT48(fVar107 * auVar16._8_4_,
                                                 CONCAT44(fVar106 * auVar16._4_4_,
                                                          fVar104 * auVar16._0_4_))));
          auVar133 = ZEXT1632(CONCAT412(fVar108 * auVar17._12_4_,
                                        CONCAT48(fVar107 * auVar17._8_4_,
                                                 CONCAT44(fVar106 * auVar17._4_4_,
                                                          fVar104 * auVar17._0_4_))));
          auVar167._8_4_ = 0x3f800000;
          auVar167._0_8_ = 0x3f8000003f800000;
          auVar167._12_4_ = 0x3f800000;
          auVar167._16_4_ = 0x3f800000;
          auVar167._20_4_ = 0x3f800000;
          auVar167._24_4_ = 0x3f800000;
          auVar167._28_4_ = 0x3f800000;
          auVar7 = vsubps_avx(auVar167,auVar121);
          auVar7 = vblendvps_avx(auVar7,auVar121,auVar14);
          auVar125 = ZEXT3264(auVar7);
          auVar7 = vsubps_avx(auVar167,auVar133);
          local_380 = vblendvps_avx(auVar7,auVar133,auVar14);
          auVar138 = ZEXT3264(auVar40);
          auVar154 = auVar123;
        }
      }
      auVar204 = ZEXT3264(local_6e0);
      auVar188 = ZEXT3264(local_6c0);
      auVar183 = ZEXT3264(local_700);
      local_4e0 = auVar138._0_32_;
      local_4c0 = auVar125._0_32_;
      auVar205 = ZEXT3264(local_6a0);
      if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar154 >> 0x7f,0) == '\0') &&
            (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar154 >> 0xbf,0) == '\0') &&
          (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar154[0x1f]) goto LAB_0114c388;
      auVar123 = vsubps_avx(local_440,local_460);
      auVar20 = vfmadd213ps_fma(auVar123,local_4c0,local_460);
      fVar126 = local_708->depth_scale;
      auVar41._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar126;
      auVar41._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar126;
      auVar41._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar126;
      auVar41._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar126;
      auVar41._16_4_ = fVar126 * 0.0;
      auVar41._20_4_ = fVar126 * 0.0;
      auVar41._24_4_ = fVar126 * 0.0;
      auVar41._28_4_ = 0;
      auVar123 = vcmpps_avx(local_4e0,auVar41,6);
      auVar7 = auVar154 & auVar123;
      auVar171 = ZEXT3264(CONCAT428(local_600,
                                    CONCAT424(local_600,
                                              CONCAT420(local_600,
                                                        CONCAT416(local_600,
                                                                  CONCAT412(local_600,
                                                                            CONCAT48(local_600,
                                                                                     CONCAT44(
                                                  local_600,local_600))))))));
      auVar175 = ZEXT3264(local_680);
      auVar145 = ZEXT3264(local_5a0);
      auVar121 = local_4c0;
      auVar133 = local_4e0;
      if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar7 >> 0x7f,0) == '\0') &&
            (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar7 >> 0xbf,0) == '\0') &&
          (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar7[0x1f]) {
LAB_0114c456:
        local_4e0 = auVar133;
        local_4c0 = auVar121;
        bVar84 = 0;
      }
      else {
        auVar122._8_4_ = 0xbf800000;
        auVar122._0_8_ = 0xbf800000bf800000;
        auVar122._12_4_ = 0xbf800000;
        auVar122._16_4_ = 0xbf800000;
        auVar122._20_4_ = 0xbf800000;
        auVar122._24_4_ = 0xbf800000;
        auVar122._28_4_ = 0xbf800000;
        auVar134._8_4_ = 0x40000000;
        auVar134._0_8_ = 0x4000000040000000;
        auVar134._12_4_ = 0x40000000;
        auVar134._16_4_ = 0x40000000;
        auVar134._20_4_ = 0x40000000;
        auVar134._24_4_ = 0x40000000;
        auVar134._28_4_ = 0x40000000;
        auVar20 = vfmadd213ps_fma(local_380,auVar134,auVar122);
        local_260 = local_4c0;
        local_240 = ZEXT1632(auVar20);
        local_220 = local_4e0;
        local_200 = 0;
        local_1fc = iVar10;
        local_1f0 = local_4f0._0_8_;
        uStack_1e8 = local_4f0._8_8_;
        local_1e0 = local_570._0_8_;
        uStack_1d8 = local_570._8_8_;
        local_1d0 = local_580._0_8_;
        uStack_1c8 = local_580._8_8_;
        local_380 = ZEXT1632(auVar20);
        auVar7 = local_380;
        if ((pGVar11->mask & ray->mask) == 0) {
          bVar84 = 0;
          auVar145 = ZEXT3264(local_5a0);
          local_580 = auVar89;
          local_570 = auVar113;
          local_4f0 = auVar140;
        }
        else {
          auVar145 = ZEXT3264(local_5a0);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (bVar84 = 1, local_580 = auVar89, local_570 = auVar113, local_4f0 = auVar140,
             pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar123 = vandps_avx(auVar123,auVar154);
            fVar126 = 1.0 / auVar116._0_4_;
            local_180[0] = fVar126 * (auVar125._0_4_ + 0.0);
            local_180[1] = fVar126 * (auVar125._4_4_ + 1.0);
            local_180[2] = fVar126 * (auVar125._8_4_ + 2.0);
            local_180[3] = fVar126 * (auVar125._12_4_ + 3.0);
            fStack_170 = fVar126 * (auVar125._16_4_ + 4.0);
            fStack_16c = fVar126 * (auVar125._20_4_ + 5.0);
            fStack_168 = fVar126 * (auVar125._24_4_ + 6.0);
            fStack_164 = auVar125._28_4_ + 7.0;
            local_380._0_8_ = auVar20._0_8_;
            local_380._8_8_ = auVar20._8_8_;
            local_160 = local_380._0_8_;
            uStack_158 = local_380._8_8_;
            uStack_150 = 0;
            uStack_148 = 0;
            local_140 = local_4e0;
            uVar85 = vmovmskps_avx(auVar123);
            lVar78 = 0;
            uVar79 = CONCAT44((int)((ulong)context->args >> 0x20),uVar85);
            for (uVar81 = uVar79; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
              lVar78 = lVar78 + 1;
            }
            local_580 = auVar89;
            local_570 = auVar113;
            local_4f0 = auVar140;
            local_380 = auVar7;
            while( true ) {
              auVar121 = auVar125._0_32_;
              auVar133 = auVar138._0_32_;
              if (uVar79 == 0) break;
              local_780._0_8_ = uVar79;
              local_554 = local_180[lVar78];
              local_550 = *(undefined4 *)((long)&local_160 + lVar78 * 4);
              local_520._0_4_ = ray->tfar;
              local_7a0._0_8_ = lVar78;
              ray->tfar = *(float *)(local_140 + lVar78 * 4);
              local_650.context = context->user;
              fVar103 = 1.0 - local_554;
              fVar126 = fVar103 * fVar103 * -3.0;
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * fVar103)),
                                        ZEXT416((uint)(local_554 * fVar103)),ZEXT416(0xc0000000));
              auVar15 = vfmsub132ss_fma(ZEXT416((uint)(local_554 * fVar103)),
                                        ZEXT416((uint)(local_554 * local_554)),ZEXT416(0x40000000));
              fVar103 = auVar20._0_4_ * 3.0;
              fVar105 = auVar15._0_4_ * 3.0;
              fVar104 = local_554 * local_554 * 3.0;
              auVar158._0_4_ = fVar104 * (float)local_3d0._0_4_;
              auVar158._4_4_ = fVar104 * (float)local_3d0._4_4_;
              auVar158._8_4_ = fVar104 * fStack_3c8;
              auVar158._12_4_ = fVar104 * fStack_3c4;
              auVar128._4_4_ = fVar105;
              auVar128._0_4_ = fVar105;
              auVar128._8_4_ = fVar105;
              auVar128._12_4_ = fVar105;
              auVar20 = vfmadd132ps_fma(auVar128,auVar158,local_580);
              auVar141._4_4_ = fVar103;
              auVar141._0_4_ = fVar103;
              auVar141._8_4_ = fVar103;
              auVar141._12_4_ = fVar103;
              auVar20 = vfmadd132ps_fma(auVar141,auVar20,local_570);
              auVar129._4_4_ = fVar126;
              auVar129._0_4_ = fVar126;
              auVar129._8_4_ = fVar126;
              auVar129._12_4_ = fVar126;
              auVar20 = vfmadd132ps_fma(auVar129,auVar20,local_4f0);
              local_560 = vmovlps_avx(auVar20);
              local_558 = vextractps_avx(auVar20,2);
              local_54c = (int)local_528;
              local_548 = (int)local_710;
              local_544 = (local_650.context)->instID[0];
              local_540 = (local_650.context)->instPrimID[0];
              local_7b4 = -1;
              local_650.valid = &local_7b4;
              local_650.geometryUserPtr = pGVar11->userPtr;
              local_650.ray = (RTCRayN *)ray;
              local_650.hit = (RTCHitN *)&local_560;
              local_650.N = 1;
              if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar11->occlusionFilterN)(&local_650), *local_650.valid != 0)) {
                p_Var12 = context->args->filter;
                if ((p_Var12 == (RTCFilterFunctionN)0x0) ||
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar11->field_8).field_0x2 & 0x40) == 0))
                    || ((*p_Var12)(&local_650), *local_650.valid != 0)))) {
                  bVar84 = 1;
                  auVar188 = ZEXT3264(local_6c0);
                  auVar183 = ZEXT3264(local_700);
                  auVar204 = ZEXT3264(local_6e0);
                  auVar205 = ZEXT3264(local_6a0);
                  auVar171 = ZEXT3264(CONCAT428(fStack_5e4,
                                                CONCAT424(fStack_5e8,
                                                          CONCAT420(fStack_5ec,
                                                                    CONCAT416(fStack_5f0,
                                                                              CONCAT412(fStack_5f4,
                                                                                        CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
                  auVar175 = ZEXT3264(local_680);
                  auVar145 = ZEXT3264(local_5a0);
                  fVar103 = (float)local_5e0;
                  fVar105 = local_5e0._4_4_;
                  fVar206 = (float)uStack_5d8;
                  fVar207 = uStack_5d8._4_4_;
                  fVar208 = (float)uStack_5d0;
                  fVar209 = uStack_5d0._4_4_;
                  fVar210 = (float)uStack_5c8;
                  uVar87 = local_5c0;
                  uVar200 = uStack_5b8;
                  goto LAB_0114c3a3;
                }
              }
              ray->tfar = (float)local_520._0_4_;
              lVar78 = 0;
              uVar79 = local_780._0_8_ ^ 1L << (local_7a0._0_8_ & 0x3f);
              for (uVar81 = uVar79; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                lVar78 = lVar78 + 1;
              }
              auVar188 = ZEXT3264(local_6c0);
              auVar183 = ZEXT3264(local_700);
              auVar125 = ZEXT3264(local_4c0);
              auVar138 = ZEXT3264(local_4e0);
              auVar204 = ZEXT3264(local_6e0);
              auVar205 = ZEXT3264(local_6a0);
              auVar171 = ZEXT3264(CONCAT428(fStack_5e4,
                                            CONCAT424(fStack_5e8,
                                                      CONCAT420(fStack_5ec,
                                                                CONCAT416(fStack_5f0,
                                                                          CONCAT412(fStack_5f4,
                                                                                    CONCAT48(
                                                  fStack_5f8,CONCAT44(fStack_5fc,local_600))))))));
              auVar175 = ZEXT3264(local_680);
              auVar145 = ZEXT3264(local_5a0);
              fVar103 = (float)local_5e0;
              fVar105 = local_5e0._4_4_;
              fVar206 = (float)uStack_5d8;
              fVar207 = uStack_5d8._4_4_;
              fVar208 = (float)uStack_5d0;
              fVar209 = uStack_5d0._4_4_;
              fVar210 = (float)uStack_5c8;
              uVar87 = local_5c0;
              uVar200 = uStack_5b8;
            }
            goto LAB_0114c456;
          }
        }
      }
    }
LAB_0114c3a3:
    auVar125 = ZEXT3264(local_740);
    auVar138 = ZEXT1664(local_760._0_16_);
    local_7a0._0_8_ = context;
    if (8 < iVar10) {
      local_340._4_4_ = iVar10;
      local_340._0_4_ = iVar10;
      local_340._8_4_ = iVar10;
      local_340._12_4_ = iVar10;
      local_340._16_4_ = iVar10;
      local_340._20_4_ = iVar10;
      local_340._24_4_ = iVar10;
      local_340._28_4_ = iVar10;
      local_e0 = local_760._0_4_;
      uStack_dc = local_e0;
      uStack_d8 = local_e0;
      uStack_d4 = local_e0;
      uStack_d0 = local_e0;
      uStack_cc = local_e0;
      uStack_c8 = local_e0;
      uStack_c4 = local_e0;
      local_100 = local_620._0_8_;
      uStack_f8 = local_620._0_8_;
      uStack_f0 = local_620._0_8_;
      uStack_e8 = local_620._0_8_;
      local_120._0_4_ = 1.0 / (float)local_3c0._0_4_;
      local_120._4_4_ = local_120._0_4_;
      fStack_118 = (float)local_120._0_4_;
      fStack_114 = (float)local_120._0_4_;
      fStack_110 = (float)local_120._0_4_;
      fStack_10c = (float)local_120._0_4_;
      fStack_108 = (float)local_120._0_4_;
      register0x0000121c = local_120._0_4_;
      auVar102 = ZEXT3264(_local_120);
      lVar78 = 8;
      uStack_5b8 = uVar200;
      local_5c0 = uVar87;
LAB_0114c883:
      if (lVar78 < local_7b0) {
        auVar96 = auVar183._0_32_;
        auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 * 4 + lVar86);
        auVar7 = *(undefined1 (*) [32])(lVar86 + 0x21fb768 + lVar78 * 4);
        local_620 = *(undefined1 (*) [32])(lVar86 + 0x21fbbec + lVar78 * 4);
        pauVar1 = (undefined1 (*) [32])(lVar86 + 0x21fc070 + lVar78 * 4);
        fVar126 = *(float *)*pauVar1;
        fVar104 = *(float *)(*pauVar1 + 4);
        fVar106 = *(float *)(*pauVar1 + 8);
        fVar107 = *(float *)(*pauVar1 + 0xc);
        fVar108 = *(float *)(*pauVar1 + 0x10);
        fVar109 = *(float *)(*pauVar1 + 0x14);
        fVar110 = *(float *)(*pauVar1 + 0x18);
        auVar76 = *(undefined1 (*) [28])*pauVar1;
        auVar183._0_4_ = fVar126 * auVar171._0_4_;
        auVar183._4_4_ = fVar104 * auVar171._4_4_;
        auVar183._8_4_ = fVar106 * auVar171._8_4_;
        auVar183._12_4_ = fVar107 * auVar171._12_4_;
        auVar183._16_4_ = fVar108 * auVar171._16_4_;
        auVar183._20_4_ = fVar109 * auVar171._20_4_;
        auVar183._28_36_ = auVar102._28_36_;
        auVar183._24_4_ = fVar110 * auVar171._24_4_;
        auVar139._0_4_ = fVar126 * fVar103;
        auVar139._4_4_ = fVar104 * fVar105;
        auVar139._8_4_ = fVar106 * fVar206;
        auVar139._12_4_ = fVar107 * fVar207;
        auVar139._16_4_ = fVar108 * fVar208;
        auVar139._20_4_ = fVar109 * fVar209;
        auVar139._28_36_ = auVar138._28_36_;
        auVar139._24_4_ = fVar110 * fVar210;
        auVar20 = vfmadd231ps_fma(auVar183._0_32_,local_620,auVar205._0_32_);
        auVar15 = vfmadd231ps_fma(auVar139._0_32_,local_620,auVar204._0_32_);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar7,auVar175._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar7,auVar125._0_32_);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar123,auVar145._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar123,local_420);
        local_760 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 * 4 + lVar86);
        auVar121 = *(undefined1 (*) [32])(lVar86 + 0x21fdb88 + lVar78 * 4);
        auVar133 = *(undefined1 (*) [32])(lVar86 + 0x21fe00c + lVar78 * 4);
        pfVar2 = (float *)(lVar86 + 0x21fe490 + lVar78 * 4);
        fVar73 = *pfVar2;
        fVar197 = pfVar2[1];
        fVar199 = pfVar2[2];
        fVar185 = pfVar2[3];
        fVar189 = pfVar2[4];
        fVar190 = pfVar2[5];
        fVar191 = pfVar2[6];
        auVar42._4_4_ = fVar197 * auVar171._4_4_;
        auVar42._0_4_ = fVar73 * auVar171._0_4_;
        auVar42._8_4_ = fVar199 * auVar171._8_4_;
        auVar42._12_4_ = fVar185 * auVar171._12_4_;
        auVar42._16_4_ = fVar189 * auVar171._16_4_;
        auVar42._20_4_ = fVar190 * auVar171._20_4_;
        auVar42._24_4_ = fVar191 * auVar171._24_4_;
        auVar42._28_4_ = auVar123._28_4_;
        auVar172._0_4_ = fVar73 * fVar103;
        auVar172._4_4_ = fVar197 * fVar105;
        auVar172._8_4_ = fVar199 * fVar206;
        auVar172._12_4_ = fVar185 * fVar207;
        auVar172._16_4_ = fVar189 * fVar208;
        auVar172._20_4_ = fVar190 * fVar209;
        auVar172._28_36_ = auVar171._28_36_;
        auVar172._24_4_ = fVar191 * fVar210;
        auVar16 = vfmadd231ps_fma(auVar42,auVar133,auVar205._0_32_);
        auVar17 = vfmadd231ps_fma(auVar172._0_32_,auVar133,auVar204._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar121,auVar175._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar121,auVar125._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_760,auVar145._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_760,local_420);
        local_460 = ZEXT1632(auVar16);
        local_320 = ZEXT1632(auVar20);
        local_440 = vsubps_avx(local_460,local_320);
        local_300 = ZEXT1632(auVar17);
        auVar101 = ZEXT1632(auVar15);
        local_3c0 = vsubps_avx(local_300,auVar101);
        auVar100._0_4_ = auVar15._0_4_ * local_440._0_4_;
        auVar100._4_4_ = auVar15._4_4_ * local_440._4_4_;
        auVar100._8_4_ = auVar15._8_4_ * local_440._8_4_;
        auVar100._12_4_ = auVar15._12_4_ * local_440._12_4_;
        auVar100._16_4_ = local_440._16_4_ * 0.0;
        auVar100._20_4_ = local_440._20_4_ * 0.0;
        auVar100._24_4_ = local_440._24_4_ * 0.0;
        auVar100._28_4_ = 0;
        fVar103 = local_3c0._0_4_;
        auVar138._0_4_ = fVar103 * auVar20._0_4_;
        fVar105 = local_3c0._4_4_;
        auVar138._4_4_ = fVar105 * auVar20._4_4_;
        fVar206 = local_3c0._8_4_;
        auVar138._8_4_ = fVar206 * auVar20._8_4_;
        fVar207 = local_3c0._12_4_;
        auVar138._12_4_ = fVar207 * auVar20._12_4_;
        fVar208 = local_3c0._16_4_;
        auVar138._16_4_ = fVar208 * 0.0;
        fVar209 = local_3c0._20_4_;
        auVar138._20_4_ = fVar209 * 0.0;
        auVar138._28_36_ = auVar125._28_36_;
        fVar210 = local_3c0._24_4_;
        auVar138._24_4_ = fVar210 * 0.0;
        auVar182 = vsubps_avx(auVar100,auVar138._0_32_);
        _local_480 = *pauVar1;
        auVar14 = _local_480;
        auVar135._0_4_ = fVar126 * (float)local_2a0._0_4_;
        auVar135._4_4_ = fVar104 * (float)local_2a0._4_4_;
        auVar135._8_4_ = fVar106 * fStack_298;
        auVar135._12_4_ = fVar107 * fStack_294;
        auVar135._16_4_ = fVar108 * fStack_290;
        auVar135._20_4_ = fVar109 * fStack_28c;
        auVar135._24_4_ = fVar110 * fStack_288;
        auVar135._28_4_ = 0;
        auVar20 = vfmadd231ps_fma(auVar135,local_620,local_a0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar7,local_80);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_280,auVar123);
        auVar138 = ZEXT1664(auVar20);
        auVar43._4_4_ = fVar197 * (float)local_2a0._4_4_;
        auVar43._0_4_ = fVar73 * (float)local_2a0._0_4_;
        auVar43._8_4_ = fVar199 * fStack_298;
        auVar43._12_4_ = fVar185 * fStack_294;
        auVar43._16_4_ = fVar189 * fStack_290;
        auVar43._20_4_ = fVar190 * fStack_28c;
        auVar43._24_4_ = fVar191 * fStack_288;
        auVar43._28_4_ = uStack_284;
        auVar16 = vfmadd231ps_fma(auVar43,auVar133,local_a0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar121,local_80);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_760,local_280);
        auVar44._4_4_ = fVar105 * fVar105;
        auVar44._0_4_ = fVar103 * fVar103;
        auVar44._8_4_ = fVar206 * fVar206;
        auVar44._12_4_ = fVar207 * fVar207;
        auVar44._16_4_ = fVar208 * fVar208;
        auVar44._20_4_ = fVar209 * fVar209;
        auVar44._24_4_ = fVar210 * fVar210;
        auVar44._28_4_ = local_280._28_4_;
        auVar17 = vfmadd231ps_fma(auVar44,local_440,local_440);
        auVar136 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar16));
        auVar179._0_4_ = auVar136._0_4_ * auVar136._0_4_ * auVar17._0_4_;
        auVar179._4_4_ = auVar136._4_4_ * auVar136._4_4_ * auVar17._4_4_;
        auVar179._8_4_ = auVar136._8_4_ * auVar136._8_4_ * auVar17._8_4_;
        auVar179._12_4_ = auVar136._12_4_ * auVar136._12_4_ * auVar17._12_4_;
        auVar179._16_4_ = auVar136._16_4_ * auVar136._16_4_ * 0.0;
        auVar179._20_4_ = auVar136._20_4_ * auVar136._20_4_ * 0.0;
        auVar179._24_4_ = auVar136._24_4_ * auVar136._24_4_ * 0.0;
        auVar179._28_4_ = 0;
        auVar45._4_4_ = auVar182._4_4_ * auVar182._4_4_;
        auVar45._0_4_ = auVar182._0_4_ * auVar182._0_4_;
        auVar45._8_4_ = auVar182._8_4_ * auVar182._8_4_;
        auVar45._12_4_ = auVar182._12_4_ * auVar182._12_4_;
        auVar45._16_4_ = auVar182._16_4_ * auVar182._16_4_;
        auVar45._20_4_ = auVar182._20_4_ * auVar182._20_4_;
        auVar45._24_4_ = auVar182._24_4_ * auVar182._24_4_;
        auVar45._28_4_ = auVar182._28_4_;
        auVar136 = vcmpps_avx(auVar45,auVar179,2);
        local_200 = (int)lVar78;
        auVar180._4_4_ = local_200;
        auVar180._0_4_ = local_200;
        auVar180._8_4_ = local_200;
        auVar180._12_4_ = local_200;
        auVar180._16_4_ = local_200;
        auVar180._20_4_ = local_200;
        auVar180._24_4_ = local_200;
        auVar180._28_4_ = local_200;
        auVar182 = vpor_avx2(auVar180,_DAT_01fb4ba0);
        auVar8 = vpcmpgtd_avx2(local_340,auVar182);
        auVar182 = auVar8 & auVar136;
        fVar103 = (float)local_5e0;
        fVar105 = local_5e0._4_4_;
        fVar206 = (float)uStack_5d8;
        fVar207 = uStack_5d8._4_4_;
        fVar208 = (float)uStack_5d0;
        fVar209 = uStack_5d0._4_4_;
        fVar210 = (float)uStack_5c8;
        if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar182 >> 0x7f,0) != '\0') ||
              (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar182 >> 0xbf,0) != '\0') ||
            (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar182[0x1f] < '\0') {
          local_360 = vandps_avx(auVar8,auVar136);
          auVar46._4_4_ = fVar197 * local_5c0._4_4_;
          auVar46._0_4_ = fVar73 * (float)local_5c0;
          auVar46._8_4_ = fVar199 * (float)uStack_5b8;
          auVar46._12_4_ = fVar185 * uStack_5b8._4_4_;
          auVar46._16_4_ = fVar189 * (float)uStack_5b0;
          auVar46._20_4_ = fVar190 * uStack_5b0._4_4_;
          auVar46._24_4_ = fVar191 * (float)uStack_5a8;
          auVar46._28_4_ = auVar136._28_4_;
          auVar17 = vfmadd213ps_fma(auVar133,local_c0,auVar46);
          auVar17 = vfmadd213ps_fma(auVar121,local_2e0,ZEXT1632(auVar17));
          auVar17 = vfmadd132ps_fma(local_760,ZEXT1632(auVar17),local_400);
          local_480._0_4_ = auVar76._0_4_;
          local_480._4_4_ = auVar76._4_4_;
          fStack_478 = auVar76._8_4_;
          fStack_474 = auVar76._12_4_;
          fStack_470 = auVar76._16_4_;
          fStack_46c = auVar76._20_4_;
          fStack_468 = auVar76._24_4_;
          auVar47._4_4_ = local_5c0._4_4_ * (float)local_480._4_4_;
          auVar47._0_4_ = (float)local_5c0 * (float)local_480._0_4_;
          auVar47._8_4_ = (float)uStack_5b8 * fStack_478;
          auVar47._12_4_ = uStack_5b8._4_4_ * fStack_474;
          auVar47._16_4_ = (float)uStack_5b0 * fStack_470;
          auVar47._20_4_ = uStack_5b0._4_4_ * fStack_46c;
          auVar47._24_4_ = (float)uStack_5a8 * fStack_468;
          auVar47._28_4_ = auVar136._28_4_;
          auVar18 = vfmadd213ps_fma(local_620,local_c0,auVar47);
          auVar18 = vfmadd213ps_fma(auVar7,local_2e0,ZEXT1632(auVar18));
          auVar7 = *(undefined1 (*) [32])(lVar86 + 0x21fc4f4 + lVar78 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar86 + 0x21fc978 + lVar78 * 4);
          auVar133 = *(undefined1 (*) [32])(lVar86 + 0x21fcdfc + lVar78 * 4);
          pfVar3 = (float *)(lVar86 + 0x21fd280 + lVar78 * 4);
          fVar126 = *pfVar3;
          fVar104 = pfVar3[1];
          fVar106 = pfVar3[2];
          fVar107 = pfVar3[3];
          fVar108 = pfVar3[4];
          fVar109 = pfVar3[5];
          fVar110 = pfVar3[6];
          auVar48._4_4_ = fStack_5fc * fVar104;
          auVar48._0_4_ = local_600 * fVar126;
          auVar48._8_4_ = fStack_5f8 * fVar106;
          auVar48._12_4_ = fStack_5f4 * fVar107;
          auVar48._16_4_ = fStack_5f0 * fVar108;
          auVar48._20_4_ = fStack_5ec * fVar109;
          auVar48._24_4_ = fStack_5e8 * fVar110;
          auVar48._28_4_ = pfVar2[7];
          auVar49._4_4_ = local_5e0._4_4_ * fVar104;
          auVar49._0_4_ = (float)local_5e0 * fVar126;
          auVar49._8_4_ = (float)uStack_5d8 * fVar106;
          auVar49._12_4_ = uStack_5d8._4_4_ * fVar107;
          auVar49._16_4_ = (float)uStack_5d0 * fVar108;
          auVar49._20_4_ = uStack_5d0._4_4_ * fVar109;
          auVar49._24_4_ = (float)uStack_5c8 * fVar110;
          auVar49._28_4_ = *(undefined4 *)(*pauVar1 + 0x1c);
          auVar50._4_4_ = fVar104 * local_5c0._4_4_;
          auVar50._0_4_ = fVar126 * (float)local_5c0;
          auVar50._8_4_ = fVar106 * (float)uStack_5b8;
          auVar50._12_4_ = fVar107 * uStack_5b8._4_4_;
          auVar50._16_4_ = fVar108 * (float)uStack_5b0;
          auVar50._20_4_ = fVar109 * uStack_5b0._4_4_;
          auVar50._24_4_ = fVar110 * (float)uStack_5a8;
          auVar50._28_4_ = pfVar3[7];
          auVar19 = vfmadd231ps_fma(auVar48,auVar133,local_6a0);
          auVar91 = vfmadd231ps_fma(auVar49,auVar133,local_6e0);
          auVar90 = vfmadd231ps_fma(auVar50,local_c0,auVar133);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar121,local_680);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar121,local_740);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),local_2e0,auVar121);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar7,local_5a0);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar7,local_420);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar7,local_400);
          pfVar2 = (float *)(lVar86 + 0x21ff6a0 + lVar78 * 4);
          fVar126 = *pfVar2;
          fVar104 = pfVar2[1];
          fVar106 = pfVar2[2];
          fVar107 = pfVar2[3];
          fVar108 = pfVar2[4];
          fVar109 = pfVar2[5];
          fVar110 = pfVar2[6];
          auVar51._4_4_ = fStack_5fc * fVar104;
          auVar51._0_4_ = local_600 * fVar126;
          auVar51._8_4_ = fStack_5f8 * fVar106;
          auVar51._12_4_ = fStack_5f4 * fVar107;
          auVar51._16_4_ = fStack_5f0 * fVar108;
          auVar51._20_4_ = fStack_5ec * fVar109;
          auVar51._24_4_ = fStack_5e8 * fVar110;
          auVar51._28_4_ = fStack_5e4;
          auVar52._4_4_ = local_5e0._4_4_ * fVar104;
          auVar52._0_4_ = (float)local_5e0 * fVar126;
          auVar52._8_4_ = (float)uStack_5d8 * fVar106;
          auVar52._12_4_ = uStack_5d8._4_4_ * fVar107;
          auVar52._16_4_ = (float)uStack_5d0 * fVar108;
          auVar52._20_4_ = uStack_5d0._4_4_ * fVar109;
          auVar52._24_4_ = (float)uStack_5c8 * fVar110;
          auVar52._28_4_ = uStack_5c8._4_4_;
          auVar53._4_4_ = fVar104 * local_5c0._4_4_;
          auVar53._0_4_ = fVar126 * (float)local_5c0;
          auVar53._8_4_ = fVar106 * (float)uStack_5b8;
          auVar53._12_4_ = fVar107 * uStack_5b8._4_4_;
          auVar53._16_4_ = fVar108 * (float)uStack_5b0;
          auVar53._20_4_ = fVar109 * uStack_5b0._4_4_;
          auVar53._24_4_ = fVar110 * (float)uStack_5a8;
          auVar53._28_4_ = pfVar2[7];
          auVar7 = *(undefined1 (*) [32])(lVar86 + 0x21ff21c + lVar78 * 4);
          auVar127 = vfmadd231ps_fma(auVar51,auVar7,local_6a0);
          auVar112 = vfmadd231ps_fma(auVar52,auVar7,local_6e0);
          auVar89 = vfmadd231ps_fma(auVar53,local_c0,auVar7);
          auVar7 = *(undefined1 (*) [32])(lVar86 + 0x21fed98 + lVar78 * 4);
          auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar7,local_680);
          auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar7,local_740);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_2e0,auVar7);
          auVar7 = *(undefined1 (*) [32])(lVar86 + 0x21fe914 + lVar78 * 4);
          auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar7,local_5a0);
          auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar7,local_420);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_400,auVar7);
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar181._16_4_ = 0x7fffffff;
          auVar181._20_4_ = 0x7fffffff;
          auVar181._24_4_ = 0x7fffffff;
          auVar181._28_4_ = 0x7fffffff;
          auVar7 = vandps_avx(ZEXT1632(auVar19),auVar181);
          auVar121 = vandps_avx(ZEXT1632(auVar91),auVar181);
          auVar121 = vmaxps_avx(auVar7,auVar121);
          auVar7 = vandps_avx(ZEXT1632(auVar90),auVar181);
          auVar7 = vmaxps_avx(auVar121,auVar7);
          auVar75._4_4_ = uStack_dc;
          auVar75._0_4_ = local_e0;
          auVar75._8_4_ = uStack_d8;
          auVar75._12_4_ = uStack_d4;
          auVar75._16_4_ = uStack_d0;
          auVar75._20_4_ = uStack_cc;
          auVar75._24_4_ = uStack_c8;
          auVar75._28_4_ = uStack_c4;
          auVar7 = vcmpps_avx(auVar7,auVar75,1);
          auVar133 = vblendvps_avx(ZEXT1632(auVar19),local_440,auVar7);
          auVar136 = vblendvps_avx(ZEXT1632(auVar91),local_3c0,auVar7);
          auVar7 = vandps_avx(ZEXT1632(auVar127),auVar181);
          auVar121 = vandps_avx(ZEXT1632(auVar112),auVar181);
          auVar121 = vmaxps_avx(auVar7,auVar121);
          auVar7 = vandps_avx(auVar181,ZEXT1632(auVar89));
          auVar7 = vmaxps_avx(auVar121,auVar7);
          auVar121 = vcmpps_avx(auVar7,auVar75,1);
          auVar7 = vblendvps_avx(ZEXT1632(auVar127),local_440,auVar121);
          auVar121 = vblendvps_avx(ZEXT1632(auVar112),local_3c0,auVar121);
          auVar18 = vfmadd213ps_fma(auVar123,local_400,ZEXT1632(auVar18));
          auVar19 = vfmadd213ps_fma(auVar133,auVar133,ZEXT832(0) << 0x20);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar136,auVar136);
          auVar123 = vrsqrtps_avx(ZEXT1632(auVar19));
          fVar126 = auVar123._0_4_;
          fVar104 = auVar123._4_4_;
          fVar106 = auVar123._8_4_;
          fVar107 = auVar123._12_4_;
          fVar108 = auVar123._16_4_;
          fVar109 = auVar123._20_4_;
          fVar110 = auVar123._24_4_;
          auVar54._4_4_ = fVar104 * fVar104 * fVar104 * auVar19._4_4_ * -0.5;
          auVar54._0_4_ = fVar126 * fVar126 * fVar126 * auVar19._0_4_ * -0.5;
          auVar54._8_4_ = fVar106 * fVar106 * fVar106 * auVar19._8_4_ * -0.5;
          auVar54._12_4_ = fVar107 * fVar107 * fVar107 * auVar19._12_4_ * -0.5;
          auVar54._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar54._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar54._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar54._28_4_ = 0;
          auVar203._8_4_ = 0x3fc00000;
          auVar203._0_8_ = 0x3fc000003fc00000;
          auVar203._12_4_ = 0x3fc00000;
          auVar203._16_4_ = 0x3fc00000;
          auVar203._20_4_ = 0x3fc00000;
          auVar203._24_4_ = 0x3fc00000;
          auVar203._28_4_ = 0x3fc00000;
          auVar19 = vfmadd231ps_fma(auVar54,auVar203,auVar123);
          fVar126 = auVar19._0_4_;
          fVar104 = auVar19._4_4_;
          auVar55._4_4_ = auVar136._4_4_ * fVar104;
          auVar55._0_4_ = auVar136._0_4_ * fVar126;
          fVar106 = auVar19._8_4_;
          auVar55._8_4_ = auVar136._8_4_ * fVar106;
          fVar107 = auVar19._12_4_;
          auVar55._12_4_ = auVar136._12_4_ * fVar107;
          auVar55._16_4_ = auVar136._16_4_ * 0.0;
          auVar55._20_4_ = auVar136._20_4_ * 0.0;
          auVar55._24_4_ = auVar136._24_4_ * 0.0;
          auVar55._28_4_ = auVar123._28_4_;
          auVar56._4_4_ = fVar104 * -auVar133._4_4_;
          auVar56._0_4_ = fVar126 * -auVar133._0_4_;
          auVar56._8_4_ = fVar106 * -auVar133._8_4_;
          auVar56._12_4_ = fVar107 * -auVar133._12_4_;
          auVar56._16_4_ = -auVar133._16_4_ * 0.0;
          auVar56._20_4_ = -auVar133._20_4_ * 0.0;
          auVar56._24_4_ = -auVar133._24_4_ * 0.0;
          auVar56._28_4_ = auVar136._28_4_;
          auVar19 = vfmadd213ps_fma(auVar7,auVar7,ZEXT832(0) << 0x20);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar121,auVar121);
          auVar123 = vrsqrtps_avx(ZEXT1632(auVar19));
          auVar57._28_4_ = local_420._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar107 * 0.0,
                                  CONCAT48(fVar106 * 0.0,CONCAT44(fVar104 * 0.0,fVar126 * 0.0))));
          fVar126 = auVar123._0_4_;
          fVar104 = auVar123._4_4_;
          fVar106 = auVar123._8_4_;
          fVar107 = auVar123._12_4_;
          fVar108 = auVar123._16_4_;
          fVar109 = auVar123._20_4_;
          fVar110 = auVar123._24_4_;
          auVar58._4_4_ = fVar104 * fVar104 * fVar104 * auVar19._4_4_ * -0.5;
          auVar58._0_4_ = fVar126 * fVar126 * fVar126 * auVar19._0_4_ * -0.5;
          auVar58._8_4_ = fVar106 * fVar106 * fVar106 * auVar19._8_4_ * -0.5;
          auVar58._12_4_ = fVar107 * fVar107 * fVar107 * auVar19._12_4_ * -0.5;
          auVar58._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar58._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar58._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar58._28_4_ = 0;
          auVar19 = vfmadd231ps_fma(auVar58,auVar203,auVar123);
          fVar126 = auVar19._0_4_;
          fVar104 = auVar19._4_4_;
          auVar59._4_4_ = auVar121._4_4_ * fVar104;
          auVar59._0_4_ = auVar121._0_4_ * fVar126;
          fVar106 = auVar19._8_4_;
          auVar59._8_4_ = auVar121._8_4_ * fVar106;
          fVar107 = auVar19._12_4_;
          auVar59._12_4_ = auVar121._12_4_ * fVar107;
          auVar59._16_4_ = auVar121._16_4_ * 0.0;
          auVar59._20_4_ = auVar121._20_4_ * 0.0;
          auVar59._24_4_ = auVar121._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar60._4_4_ = fVar104 * -auVar7._4_4_;
          auVar60._0_4_ = fVar126 * -auVar7._0_4_;
          auVar60._8_4_ = fVar106 * -auVar7._8_4_;
          auVar60._12_4_ = fVar107 * -auVar7._12_4_;
          auVar60._16_4_ = -auVar7._16_4_ * 0.0;
          auVar60._20_4_ = -auVar7._20_4_ * 0.0;
          auVar60._24_4_ = -auVar7._24_4_ * 0.0;
          auVar60._28_4_ = auVar123._28_4_;
          auVar61._28_4_ = 0xbf000000;
          auVar61._0_28_ =
               ZEXT1628(CONCAT412(fVar107 * 0.0,
                                  CONCAT48(fVar106 * 0.0,CONCAT44(fVar104 * 0.0,fVar126 * 0.0))));
          auVar19 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar20),local_320);
          auVar123 = ZEXT1632(auVar20);
          auVar91 = vfmadd213ps_fma(auVar56,auVar123,auVar101);
          auVar90 = vfmadd213ps_fma(auVar57,auVar123,ZEXT1632(auVar18));
          auVar89 = vfnmadd213ps_fma(auVar55,auVar123,local_320);
          auVar127 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar16),local_460);
          auVar113 = vfnmadd213ps_fma(auVar56,auVar123,auVar101);
          auVar123 = ZEXT1632(auVar16);
          auVar112 = vfmadd213ps_fma(auVar60,auVar123,local_300);
          local_780 = ZEXT1632(auVar20);
          auVar20 = vfnmadd231ps_fma(ZEXT1632(auVar18),local_780,auVar57);
          auVar18 = vfmadd213ps_fma(auVar61,auVar123,ZEXT1632(auVar17));
          auVar140 = vfnmadd213ps_fma(auVar59,auVar123,local_460);
          auVar147 = vfnmadd213ps_fma(auVar60,auVar123,local_300);
          auVar88 = vfnmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar61);
          auVar123 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar113));
          auVar7 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar20));
          auVar62._4_4_ = auVar123._4_4_ * auVar20._4_4_;
          auVar62._0_4_ = auVar123._0_4_ * auVar20._0_4_;
          auVar62._8_4_ = auVar123._8_4_ * auVar20._8_4_;
          auVar62._12_4_ = auVar123._12_4_ * auVar20._12_4_;
          auVar62._16_4_ = auVar123._16_4_ * 0.0;
          auVar62._20_4_ = auVar123._20_4_ * 0.0;
          auVar62._24_4_ = auVar123._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar113),auVar7);
          auVar63._4_4_ = auVar89._4_4_ * auVar7._4_4_;
          auVar63._0_4_ = auVar89._0_4_ * auVar7._0_4_;
          auVar63._8_4_ = auVar89._8_4_ * auVar7._8_4_;
          auVar63._12_4_ = auVar89._12_4_ * auVar7._12_4_;
          auVar63._16_4_ = auVar7._16_4_ * 0.0;
          auVar63._20_4_ = auVar7._20_4_ * 0.0;
          auVar63._24_4_ = auVar7._24_4_ * 0.0;
          auVar63._28_4_ = auVar7._28_4_;
          auVar182 = ZEXT1632(auVar89);
          auVar7 = vsubps_avx(ZEXT1632(auVar127),auVar182);
          auVar101 = ZEXT1632(auVar20);
          auVar20 = vfmsub231ps_fma(auVar63,auVar101,auVar7);
          auVar64._4_4_ = auVar113._4_4_ * auVar7._4_4_;
          auVar64._0_4_ = auVar113._0_4_ * auVar7._0_4_;
          auVar64._8_4_ = auVar113._8_4_ * auVar7._8_4_;
          auVar64._12_4_ = auVar113._12_4_ * auVar7._12_4_;
          auVar64._16_4_ = auVar7._16_4_ * 0.0;
          auVar64._20_4_ = auVar7._20_4_ * 0.0;
          auVar64._24_4_ = auVar7._24_4_ * 0.0;
          auVar64._28_4_ = auVar7._28_4_;
          auVar89 = vfmsub231ps_fma(auVar64,auVar182,auVar123);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar13 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
          auVar123 = vblendvps_avx(ZEXT1632(auVar140),ZEXT1632(auVar19),auVar13);
          local_620 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar91),auVar13);
          auVar7 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar90),auVar13);
          auVar121 = vblendvps_avx(auVar182,ZEXT1632(auVar127),auVar13);
          auVar133 = vblendvps_avx(ZEXT1632(auVar113),ZEXT1632(auVar112),auVar13);
          auVar136 = vblendvps_avx(auVar101,ZEXT1632(auVar18),auVar13);
          auVar182 = vblendvps_avx(ZEXT1632(auVar127),auVar182,auVar13);
          auVar8 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar113),auVar13);
          auVar20 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
          local_760 = ZEXT1632(auVar20);
          auVar101 = vblendvps_avx(ZEXT1632(auVar18),auVar101,auVar13);
          auVar182 = vsubps_avx(auVar182,auVar123);
          auVar8 = vsubps_avx(auVar8,local_620);
          auVar21 = vsubps_avx(auVar101,auVar7);
          auVar22 = vsubps_avx(auVar123,auVar121);
          auVar23 = vsubps_avx(local_620,auVar133);
          auVar95 = vsubps_avx(auVar7,auVar136);
          auVar161._0_4_ = auVar21._0_4_ * auVar123._0_4_;
          auVar161._4_4_ = auVar21._4_4_ * auVar123._4_4_;
          auVar161._8_4_ = auVar21._8_4_ * auVar123._8_4_;
          auVar161._12_4_ = auVar21._12_4_ * auVar123._12_4_;
          auVar161._16_4_ = auVar21._16_4_ * auVar123._16_4_;
          auVar161._20_4_ = auVar21._20_4_ * auVar123._20_4_;
          auVar161._24_4_ = auVar21._24_4_ * auVar123._24_4_;
          auVar161._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar161,auVar7,auVar182);
          auVar65._4_4_ = auVar182._4_4_ * local_620._4_4_;
          auVar65._0_4_ = auVar182._0_4_ * local_620._0_4_;
          auVar65._8_4_ = auVar182._8_4_ * local_620._8_4_;
          auVar65._12_4_ = auVar182._12_4_ * local_620._12_4_;
          auVar65._16_4_ = auVar182._16_4_ * local_620._16_4_;
          auVar65._20_4_ = auVar182._20_4_ * local_620._20_4_;
          auVar65._24_4_ = auVar182._24_4_ * local_620._24_4_;
          auVar65._28_4_ = auVar101._28_4_;
          auVar18 = vfmsub231ps_fma(auVar65,auVar123,auVar8);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar162._0_4_ = auVar8._0_4_ * auVar7._0_4_;
          auVar162._4_4_ = auVar8._4_4_ * auVar7._4_4_;
          auVar162._8_4_ = auVar8._8_4_ * auVar7._8_4_;
          auVar162._12_4_ = auVar8._12_4_ * auVar7._12_4_;
          auVar162._16_4_ = auVar8._16_4_ * auVar7._16_4_;
          auVar162._20_4_ = auVar8._20_4_ * auVar7._20_4_;
          auVar162._24_4_ = auVar8._24_4_ * auVar7._24_4_;
          auVar162._28_4_ = 0;
          auVar18 = vfmsub231ps_fma(auVar162,local_620,auVar21);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
          auVar138 = ZEXT1664(auVar18);
          auVar163._0_4_ = auVar95._0_4_ * auVar121._0_4_;
          auVar163._4_4_ = auVar95._4_4_ * auVar121._4_4_;
          auVar163._8_4_ = auVar95._8_4_ * auVar121._8_4_;
          auVar163._12_4_ = auVar95._12_4_ * auVar121._12_4_;
          auVar163._16_4_ = auVar95._16_4_ * auVar121._16_4_;
          auVar163._20_4_ = auVar95._20_4_ * auVar121._20_4_;
          auVar163._24_4_ = auVar95._24_4_ * auVar121._24_4_;
          auVar163._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar163,auVar22,auVar136);
          auVar66._4_4_ = auVar23._4_4_ * auVar136._4_4_;
          auVar66._0_4_ = auVar23._0_4_ * auVar136._0_4_;
          auVar66._8_4_ = auVar23._8_4_ * auVar136._8_4_;
          auVar66._12_4_ = auVar23._12_4_ * auVar136._12_4_;
          auVar66._16_4_ = auVar23._16_4_ * auVar136._16_4_;
          auVar66._20_4_ = auVar23._20_4_ * auVar136._20_4_;
          auVar66._24_4_ = auVar23._24_4_ * auVar136._24_4_;
          auVar66._28_4_ = auVar136._28_4_;
          auVar19 = vfmsub231ps_fma(auVar66,auVar133,auVar95);
          auVar67._4_4_ = auVar22._4_4_ * auVar133._4_4_;
          auVar67._0_4_ = auVar22._0_4_ * auVar133._0_4_;
          auVar67._8_4_ = auVar22._8_4_ * auVar133._8_4_;
          auVar67._12_4_ = auVar22._12_4_ * auVar133._12_4_;
          auVar67._16_4_ = auVar22._16_4_ * auVar133._16_4_;
          auVar67._20_4_ = auVar22._20_4_ * auVar133._20_4_;
          auVar67._24_4_ = auVar22._24_4_ * auVar133._24_4_;
          auVar67._28_4_ = auVar133._28_4_;
          auVar91 = vfmsub231ps_fma(auVar67,auVar23,auVar121);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
          auVar121 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
          auVar121 = vcmpps_avx(auVar121,ZEXT832(0) << 0x20,2);
          auVar17 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
          auVar20 = vpand_avx(auVar17,auVar20);
          auVar121 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0x7f,0) == '\0') &&
                (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0xbf,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar121[0x1f]) {
LAB_0114d42a:
            auVar144._8_8_ = uStack_498;
            auVar144._0_8_ = local_4a0;
            auVar144._16_8_ = uStack_490;
            auVar144._24_8_ = uStack_488;
            auVar188 = ZEXT3264(auVar188._0_32_);
            auVar183 = ZEXT3264(auVar96);
          }
          else {
            auVar68._4_4_ = auVar8._4_4_ * auVar95._4_4_;
            auVar68._0_4_ = auVar8._0_4_ * auVar95._0_4_;
            auVar68._8_4_ = auVar8._8_4_ * auVar95._8_4_;
            auVar68._12_4_ = auVar8._12_4_ * auVar95._12_4_;
            auVar68._16_4_ = auVar8._16_4_ * auVar95._16_4_;
            auVar68._20_4_ = auVar8._20_4_ * auVar95._20_4_;
            auVar68._24_4_ = auVar8._24_4_ * auVar95._24_4_;
            auVar68._28_4_ = auVar121._28_4_;
            auVar127 = vfmsub231ps_fma(auVar68,auVar23,auVar21);
            auVar168._0_4_ = auVar22._0_4_ * auVar21._0_4_;
            auVar168._4_4_ = auVar22._4_4_ * auVar21._4_4_;
            auVar168._8_4_ = auVar22._8_4_ * auVar21._8_4_;
            auVar168._12_4_ = auVar22._12_4_ * auVar21._12_4_;
            auVar168._16_4_ = auVar22._16_4_ * auVar21._16_4_;
            auVar168._20_4_ = auVar22._20_4_ * auVar21._20_4_;
            auVar168._24_4_ = auVar22._24_4_ * auVar21._24_4_;
            auVar168._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar168,auVar182,auVar95);
            auVar69._4_4_ = auVar182._4_4_ * auVar23._4_4_;
            auVar69._0_4_ = auVar182._0_4_ * auVar23._0_4_;
            auVar69._8_4_ = auVar182._8_4_ * auVar23._8_4_;
            auVar69._12_4_ = auVar182._12_4_ * auVar23._12_4_;
            auVar69._16_4_ = auVar182._16_4_ * auVar23._16_4_;
            auVar69._20_4_ = auVar182._20_4_ * auVar23._20_4_;
            auVar69._24_4_ = auVar182._24_4_ * auVar23._24_4_;
            auVar69._28_4_ = auVar23._28_4_;
            auVar112 = vfmsub231ps_fma(auVar69,auVar22,auVar8);
            auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar90),ZEXT1632(auVar112));
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar127),ZEXT832(0) << 0x20);
            auVar121 = vrcpps_avx(ZEXT1632(auVar91));
            auVar196._8_4_ = 0x3f800000;
            auVar196._0_8_ = 0x3f8000003f800000;
            auVar196._12_4_ = 0x3f800000;
            auVar196._16_4_ = 0x3f800000;
            auVar196._20_4_ = 0x3f800000;
            auVar196._24_4_ = 0x3f800000;
            auVar196._28_4_ = 0x3f800000;
            auVar17 = vfnmadd213ps_fma(auVar121,ZEXT1632(auVar91),auVar196);
            auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar121,auVar121);
            auVar70._4_4_ = auVar112._4_4_ * auVar7._4_4_;
            auVar70._0_4_ = auVar112._0_4_ * auVar7._0_4_;
            auVar70._8_4_ = auVar112._8_4_ * auVar7._8_4_;
            auVar70._12_4_ = auVar112._12_4_ * auVar7._12_4_;
            auVar70._16_4_ = auVar7._16_4_ * 0.0;
            auVar70._20_4_ = auVar7._20_4_ * 0.0;
            auVar70._24_4_ = auVar7._24_4_ * 0.0;
            auVar70._28_4_ = auVar7._28_4_;
            auVar90 = vfmadd231ps_fma(auVar70,ZEXT1632(auVar90),local_620);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT1632(auVar127),auVar123);
            fVar104 = auVar17._0_4_;
            fVar106 = auVar17._4_4_;
            fVar107 = auVar17._8_4_;
            fVar108 = auVar17._12_4_;
            auVar133 = ZEXT1632(CONCAT412(fVar108 * auVar90._12_4_,
                                          CONCAT48(fVar107 * auVar90._8_4_,
                                                   CONCAT44(fVar106 * auVar90._4_4_,
                                                            fVar104 * auVar90._0_4_))));
            fVar126 = ray->tfar;
            auVar143._4_4_ = fVar126;
            auVar143._0_4_ = fVar126;
            auVar143._8_4_ = fVar126;
            auVar143._12_4_ = fVar126;
            auVar143._16_4_ = fVar126;
            auVar143._20_4_ = fVar126;
            auVar143._24_4_ = fVar126;
            auVar143._28_4_ = fVar126;
            auVar74._8_8_ = uStack_f8;
            auVar74._0_8_ = local_100;
            auVar74._16_8_ = uStack_f0;
            auVar74._24_8_ = uStack_e8;
            auVar7 = vcmpps_avx(auVar74,auVar133,2);
            auVar121 = vcmpps_avx(auVar133,auVar143,2);
            auVar7 = vandps_avx(auVar121,auVar7);
            auVar17 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
            auVar20 = vpand_avx(auVar20,auVar17);
            auVar7 = vpmovsxwd_avx2(auVar20);
            if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar7 >> 0x7f,0) == '\0') &&
                  (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar7 >> 0xbf,0) == '\0') &&
                (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar7[0x1f]) goto LAB_0114d42a;
            auVar7 = vcmpps_avx(ZEXT1632(auVar91),ZEXT832(0) << 0x20,4);
            auVar17 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
            auVar20 = vpand_avx(auVar20,auVar17);
            auVar7 = vpmovsxwd_avx2(auVar20);
            auVar144._8_8_ = uStack_498;
            auVar144._0_8_ = local_4a0;
            auVar144._16_8_ = uStack_490;
            auVar144._24_8_ = uStack_488;
            auVar188 = ZEXT3264(auVar188._0_32_);
            auVar183 = ZEXT3264(auVar96);
            if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar7 >> 0x7f,0) != '\0') ||
                  (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar7 >> 0xbf,0) != '\0') ||
                (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar7[0x1f] < '\0') {
              auVar136 = ZEXT1632(CONCAT412(fVar108 * auVar18._12_4_,
                                            CONCAT48(fVar107 * auVar18._8_4_,
                                                     CONCAT44(fVar106 * auVar18._4_4_,
                                                              fVar104 * auVar18._0_4_))));
              auVar71._28_4_ = SUB84(uStack_488,4);
              auVar71._0_28_ =
                   ZEXT1628(CONCAT412(fVar108 * auVar19._12_4_,
                                      CONCAT48(fVar107 * auVar19._8_4_,
                                               CONCAT44(fVar106 * auVar19._4_4_,
                                                        fVar104 * auVar19._0_4_))));
              auVar174._8_4_ = 0x3f800000;
              auVar174._0_8_ = 0x3f8000003f800000;
              auVar174._12_4_ = 0x3f800000;
              auVar174._16_4_ = 0x3f800000;
              auVar174._20_4_ = 0x3f800000;
              auVar174._24_4_ = 0x3f800000;
              auVar174._28_4_ = 0x3f800000;
              auVar121 = vsubps_avx(auVar174,auVar136);
              auVar121 = vblendvps_avx(auVar121,auVar136,auVar13);
              auVar188 = ZEXT3264(auVar121);
              auVar121 = vsubps_avx(auVar174,auVar71);
              local_3a0 = vblendvps_avx(auVar121,auVar71,auVar13);
              auVar138 = ZEXT3264(local_3a0);
              auVar183 = ZEXT3264(auVar133);
              auVar144 = auVar7;
            }
          }
          auVar205 = ZEXT3264(local_6a0);
          auVar204 = ZEXT3264(local_6e0);
          if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar144 >> 0x7f,0) == '\0') &&
                (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar144 >> 0xbf,0) == '\0') &&
              (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar144[0x1f]) goto LAB_0114d047;
          auVar7 = vsubps_avx(ZEXT1632(auVar16),local_780);
          local_260 = auVar188._0_32_;
          auVar20 = vfmadd213ps_fma(auVar7,local_260,local_780);
          fVar126 = local_708->depth_scale;
          auVar72._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar126;
          auVar72._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar126;
          auVar72._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar126;
          auVar72._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar126;
          auVar72._16_4_ = fVar126 * 0.0;
          auVar72._20_4_ = fVar126 * 0.0;
          auVar72._24_4_ = fVar126 * 0.0;
          auVar72._28_4_ = fVar126;
          local_220 = auVar183._0_32_;
          auVar7 = vcmpps_avx(local_220,auVar72,6);
          auVar102 = ZEXT3264(auVar7);
          auVar121 = auVar144 & auVar7;
          auVar171 = ZEXT3264(CONCAT428(fStack_5e4,
                                        CONCAT424(fStack_5e8,
                                                  CONCAT420(fStack_5ec,
                                                            CONCAT416(fStack_5f0,
                                                                      CONCAT412(fStack_5f4,
                                                                                CONCAT48(fStack_5f8,
                                                                                         CONCAT44(
                                                  fStack_5fc,local_600))))))));
          auVar175 = ZEXT3264(local_680);
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0x7f,0) == '\0') &&
                (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0xbf,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar121[0x1f]) {
            auVar125 = ZEXT3264(local_740);
            goto LAB_0114d059;
          }
          auVar124._8_4_ = 0xbf800000;
          auVar124._0_8_ = 0xbf800000bf800000;
          auVar124._12_4_ = 0xbf800000;
          auVar124._16_4_ = 0xbf800000;
          auVar124._20_4_ = 0xbf800000;
          auVar124._24_4_ = 0xbf800000;
          auVar124._28_4_ = 0xbf800000;
          auVar137._8_4_ = 0x40000000;
          auVar137._0_8_ = 0x4000000040000000;
          auVar137._12_4_ = 0x40000000;
          auVar137._16_4_ = 0x40000000;
          auVar137._20_4_ = 0x40000000;
          auVar137._24_4_ = 0x40000000;
          auVar137._28_4_ = 0x40000000;
          auVar138 = ZEXT3264(auVar137);
          auVar20 = vfmadd213ps_fma(local_3a0,auVar137,auVar124);
          local_240 = ZEXT1632(auVar20);
          local_1fc = iVar10;
          local_1f0 = local_4f0._0_8_;
          uStack_1e8 = local_4f0._8_8_;
          local_1e0 = local_570._0_8_;
          uStack_1d8 = local_570._8_8_;
          local_1d0 = local_580._0_8_;
          uStack_1c8 = local_580._8_8_;
          pGVar11 = (((RayQueryContext *)local_7a0._0_8_)->scene->geometries).items[local_710].ptr;
          local_3a0 = ZEXT1632(auVar20);
          auVar121 = local_3a0;
          if ((pGVar11->mask & ray->mask) == 0) {
            pRVar80 = (RTCIntersectArguments *)0x0;
            auVar125 = ZEXT3264(local_740);
          }
          else {
            pRVar80 = ((RayQueryContext *)local_7a0._0_8_)->args;
            auVar125 = ZEXT3264(local_740);
            if ((pRVar80->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar80 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar80 >> 8),1),
               pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_520 = ZEXT1632(CONCAT88(auVar15._8_8_,pGVar11));
              local_7a0._8_24_ = auVar123._8_24_;
              auVar123 = vandps_avx(auVar7,auVar144);
              auVar102 = ZEXT3264(auVar123);
              local_6c0 = local_260;
              fVar126 = (float)local_200;
              auVar138 = ZEXT3264(CONCAT428(fVar126,CONCAT424(fVar126,CONCAT420(fVar126,CONCAT416(
                                                  fVar126,CONCAT412(fVar126,CONCAT48(fVar126,
                                                  CONCAT44(fVar126,fVar126))))))));
              local_180[0] = (fVar126 + auVar188._0_4_ + 0.0) * (float)local_120._0_4_;
              local_180[1] = (fVar126 + auVar188._4_4_ + 1.0) * (float)local_120._4_4_;
              local_180[2] = (fVar126 + auVar188._8_4_ + 2.0) * fStack_118;
              local_180[3] = (fVar126 + auVar188._12_4_ + 3.0) * fStack_114;
              fStack_170 = (fVar126 + auVar188._16_4_ + 4.0) * fStack_110;
              fStack_16c = (fVar126 + auVar188._20_4_ + 5.0) * fStack_10c;
              fStack_168 = (fVar126 + auVar188._24_4_ + 6.0) * fStack_108;
              fStack_164 = fVar126 + auVar188._28_4_ + 7.0;
              local_3a0._0_8_ = auVar20._0_8_;
              local_3a0._8_8_ = auVar20._8_8_;
              local_160 = local_3a0._0_8_;
              uStack_158 = local_3a0._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_700 = local_220;
              local_140 = local_220;
              uVar85 = vmovmskps_avx(auVar123);
              uVar81 = CONCAT44((int)((ulong)pRVar80 >> 0x20),uVar85);
              _local_480 = auVar14;
              local_3a0 = auVar121;
              do {
                lVar83 = 0;
                for (uVar79 = uVar81; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000)
                {
                  lVar83 = lVar83 + 1;
                }
                local_760._0_8_ = lVar83;
                local_780._0_8_ = uVar81;
                if (uVar81 == 0) {
                  pRVar80 = (RTCIntersectArguments *)0x0;
                  goto LAB_0114d462;
                }
                local_554 = local_180[lVar83];
                auVar102 = ZEXT464((uint)local_554);
                local_550 = *(undefined4 *)((long)&local_160 + lVar83 * 4);
                local_620._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_140 + lVar83 * 4);
                local_650.context = *(RTCRayQueryContext **)(local_7a0._0_8_ + 8);
                fVar103 = 1.0 - local_554;
                fVar126 = fVar103 * fVar103 * -3.0;
                auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar103 * fVar103)),
                                          ZEXT416((uint)(local_554 * fVar103)),ZEXT416(0xc0000000));
                auVar15 = vfmsub132ss_fma(ZEXT416((uint)(local_554 * fVar103)),
                                          ZEXT416((uint)(local_554 * local_554)),ZEXT416(0x40000000)
                                         );
                fVar103 = auVar20._0_4_ * 3.0;
                fVar105 = auVar15._0_4_ * 3.0;
                fVar104 = local_554 * local_554 * 3.0;
                auVar159._0_4_ = fVar104 * (float)local_3d0._0_4_;
                auVar159._4_4_ = fVar104 * (float)local_3d0._4_4_;
                auVar159._8_4_ = fVar104 * fStack_3c8;
                auVar159._12_4_ = fVar104 * fStack_3c4;
                auVar130._4_4_ = fVar105;
                auVar130._0_4_ = fVar105;
                auVar130._8_4_ = fVar105;
                auVar130._12_4_ = fVar105;
                auVar20 = vfmadd132ps_fma(auVar130,auVar159,local_580);
                auVar142._4_4_ = fVar103;
                auVar142._0_4_ = fVar103;
                auVar142._8_4_ = fVar103;
                auVar142._12_4_ = fVar103;
                auVar20 = vfmadd132ps_fma(auVar142,auVar20,local_570);
                auVar131._4_4_ = fVar126;
                auVar131._0_4_ = fVar126;
                auVar131._8_4_ = fVar126;
                auVar131._12_4_ = fVar126;
                auVar20 = vfmadd132ps_fma(auVar131,auVar20,local_4f0);
                auVar138 = ZEXT1664(auVar20);
                local_560 = vmovlps_avx(auVar20);
                local_558 = vextractps_avx(auVar20,2);
                local_54c = (int)local_528;
                local_548 = (int)local_710;
                local_544 = (local_650.context)->instID[0];
                local_540 = (local_650.context)->instPrimID[0];
                local_7b4 = -1;
                local_650.valid = &local_7b4;
                local_650.geometryUserPtr = *(void **)(local_520._0_8_ + 0x18);
                local_650.ray = (RTCRayN *)ray;
                local_650.hit = (RTCHitN *)&local_560;
                local_650.N = 1;
                if (*(code **)(local_520._0_8_ + 0x48) == (code *)0x0) {
LAB_0114d3ab:
                  p_Var12 = (*(RTCIntersectArguments **)(local_7a0._0_8_ + 0x10))->filter;
                  if ((p_Var12 == (RTCFilterFunctionN)0x0) ||
                     ((((*(RTCIntersectArguments **)(local_7a0._0_8_ + 0x10))->flags &
                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT
                      && ((*(byte *)(local_520._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_0114d45c;
                  auVar138 = ZEXT1664(auVar138._0_16_);
                  auVar102._0_8_ = (*p_Var12)(&local_650);
                  auVar102._8_56_ = extraout_var_00;
                  if (*local_650.valid != 0) goto LAB_0114d45c;
                }
                else {
                  auVar138 = ZEXT1664(auVar20);
                  auVar102._0_8_ = (**(code **)(local_520._0_8_ + 0x48))(&local_650);
                  auVar102._8_56_ = extraout_var;
                  if (*local_650.valid != 0) goto LAB_0114d3ab;
                }
                auVar102 = ZEXT464((uint)local_620._0_4_);
                ray->tfar = (float)local_620._0_4_;
                uVar81 = local_780._0_8_ ^ 1L << (local_760._0_8_ & 0x3f);
              } while( true );
            }
          }
          goto LAB_0114d422;
        }
        auVar183 = ZEXT3264(auVar96);
        local_780 = local_340;
LAB_0114d047:
        auVar205 = ZEXT3264(local_6a0);
        auVar204 = ZEXT3264(local_6e0);
        auVar102 = ZEXT3264(local_780);
        auVar125 = ZEXT3264(local_740);
        auVar171 = ZEXT3264(CONCAT428(fStack_5e4,
                                      CONCAT424(fStack_5e8,
                                                CONCAT420(fStack_5ec,
                                                          CONCAT416(fStack_5f0,
                                                                    CONCAT412(fStack_5f4,
                                                                              CONCAT48(fStack_5f8,
                                                                                       CONCAT44(
                                                  fStack_5fc,local_600))))))));
        auVar175 = ZEXT3264(local_680);
        goto LAB_0114d059;
      }
    }
    if (bVar84 != 0) break;
    fVar126 = ray->tfar;
    auVar94._4_4_ = fVar126;
    auVar94._0_4_ = fVar126;
    auVar94._8_4_ = fVar126;
    auVar94._12_4_ = fVar126;
    auVar20 = vcmpps_avx(local_2c0,auVar94,2);
    uVar82 = vmovmskps_avx(auVar20);
    context = (RayQueryContext *)local_7a0._0_8_;
  }
  return uVar77 != 0;
LAB_0114d45c:
  pRVar80 = (RTCIntersectArguments *)0x1;
LAB_0114d462:
  auVar188 = ZEXT3264(local_6c0);
  auVar183 = ZEXT3264(local_700);
  auVar125 = ZEXT3264(local_740);
  auVar204 = ZEXT3264(local_6e0);
  auVar205 = ZEXT3264(local_6a0);
  auVar171 = ZEXT3264(CONCAT428(fStack_5e4,
                                CONCAT424(fStack_5e8,
                                          CONCAT420(fStack_5ec,
                                                    CONCAT416(fStack_5f0,
                                                              CONCAT412(fStack_5f4,
                                                                        CONCAT48(fStack_5f8,
                                                                                 CONCAT44(fStack_5fc
                                                                                          ,local_600
                                                                                         ))))))));
  auVar175 = ZEXT3264(local_680);
  fVar103 = (float)local_5e0;
  fVar105 = local_5e0._4_4_;
  fVar206 = (float)uStack_5d8;
  fVar207 = uStack_5d8._4_4_;
  fVar208 = (float)uStack_5d0;
  fVar209 = uStack_5d0._4_4_;
  fVar210 = (float)uStack_5c8;
LAB_0114d422:
  bVar84 = bVar84 | (byte)pRVar80;
LAB_0114d059:
  lVar78 = lVar78 + 8;
  auVar145 = ZEXT3264(local_5a0);
  goto LAB_0114c883;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }